

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void reverse_sequence_iterator_kvs_test(void)

{
  fdb_encryption_key *pfVar1;
  bool *pbVar2;
  fdb_status fVar3;
  int iVar4;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar9;
  btree *pbVar10;
  fdb_kvs_handle *pfVar11;
  fdb_iterator **ppfVar12;
  fdb_file_handle **ptr_fhandle;
  fdb_kvs_handle *pfVar13;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *ptr_handle;
  fdb_doc *pfVar14;
  fdb_doc *pfVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  fdb_kvs_handle **ppfVar17;
  fdb_config *pfVar18;
  uint uVar19;
  uint uVar20;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *unaff_RBP;
  fdb_doc **doc;
  char *pcVar21;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R12;
  long lVar22;
  fdb_kvs_handle *pfVar23;
  int iVar24;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R13;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar25;
  fdb_doc *doc_00;
  fdb_kvs_handle *pfVar26;
  fdb_config *pfVar27;
  char *doc_01;
  ulong uVar28;
  bool bVar29;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_iterator *iterator2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv2;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_5060;
  fdb_kvs_handle *pfStack_5058;
  fdb_file_handle *pfStack_5050;
  fdb_doc *pfStack_5048;
  fdb_kvs_config fStack_5040;
  timeval tStack_5028;
  fdb_config fStack_5018;
  fdb_config *pfStack_4f20;
  fdb_iterator *pfStack_4f08;
  fdb_kvs_handle *pfStack_4f00;
  fdb_doc *pfStack_4ef8;
  fdb_file_handle *pfStack_4ef0;
  fdb_kvs_config fStack_4ee8;
  timeval tStack_4ed0;
  fdb_config fStack_4ec0;
  fdb_config *pfStack_4dc8;
  fdb_iterator *pfStack_4db0;
  fdb_kvs_handle *pfStack_4da8;
  fdb_file_handle *pfStack_4da0;
  fdb_doc *pfStack_4d98;
  uint64_t uStack_4d90;
  undefined1 uStack_4d88;
  undefined7 uStack_4d80;
  undefined4 uStack_4d79;
  undefined8 uStack_4d70;
  undefined7 uStack_4d68;
  undefined4 uStack_4d61;
  fdb_kvs_config fStack_4d58;
  timeval tStack_4d40;
  undefined4 uStack_4d30;
  undefined1 uStack_4d2c;
  fdb_config fStack_4c28;
  char acStack_4b30 [256];
  fdb_config *pfStack_4a30;
  char *pcStack_4a28;
  code *pcStack_4a20;
  fdb_doc *pfStack_4a08;
  fdb_iterator *pfStack_4a00;
  fdb_kvs_handle *pfStack_49f8;
  fdb_file_handle *pfStack_49f0;
  fdb_kvs_config fStack_49e8;
  timeval tStack_49d0;
  fdb_config fStack_49c0;
  fdb_iterator **ppfStack_48c8;
  fdb_iterator *pfStack_48b0;
  fdb_doc *pfStack_48a8;
  fdb_kvs_handle *pfStack_48a0;
  fdb_file_handle *pfStack_4898;
  timeval tStack_4890;
  fdb_iterator *apfStack_4880 [33];
  fdb_kvs_config fStack_4778;
  char acStack_4760 [264];
  fdb_config fStack_4658;
  char acStack_4560 [256];
  fdb_kvs_handle *pfStack_4460;
  fdb_kvs_handle *pfStack_4458;
  fdb_doc **ppfStack_4450;
  fdb_doc **ppfStack_4448;
  fdb_doc **ppfStack_4440;
  fdb_kvs_handle *pfStack_4430;
  fdb_file_handle *pfStack_4428;
  fdb_iterator *pfStack_4420;
  fdb_doc *pfStack_4418;
  fdb_kvs_handle *pfStack_4410;
  fdb_doc *pfStack_4408;
  fdb_kvs_config fStack_4400;
  timeval tStack_43e8;
  fdb_doc *apfStack_43d8 [32];
  undefined1 auStack_42d8 [272];
  uint8_t auStack_41c8 [20];
  undefined4 uStack_41b4;
  undefined4 uStack_41ac;
  undefined1 uStack_41a2;
  fdb_doc *apfStack_40d8 [500];
  fdb_kvs_handle afStack_3138 [7];
  fdb_kvs_handle **ppfStack_2190;
  fdb_kvs_handle *pfStack_2188;
  fdb_doc **ppfStack_2178;
  fdb_doc **ppfStack_2170;
  fdb_doc **ppfStack_2168;
  fdb_kvs_handle *pfStack_2158;
  fdb_iterator *pfStack_2150;
  fdb_iterator *pfStack_2148;
  fdb_kvs_handle *pfStack_2140;
  fdb_file_handle *pfStack_2138;
  fdb_doc *pfStack_2130;
  fdb_file_handle *pfStack_2128;
  undefined1 auStack_2120 [56];
  fdb_config fStack_20e8;
  fdb_doc *apfStack_1ff0 [65];
  fdb_config **ppfStack_1de8;
  btree *pbStack_1de0;
  fdb_kvs_handle **ppfStack_1dd8;
  fdb_config *pfStack_1dd0;
  fdb_file_handle **ppfStack_1dc8;
  fdb_kvs_handle *pfStack_1dc0;
  fdb_config *pfStack_1db0;
  fdb_config *pfStack_1da8;
  fdb_kvs_handle *pfStack_1da0;
  fdb_file_handle *pfStack_1d98;
  fdb_kvs_config fStack_1d90;
  fdb_doc *apfStack_1d78 [5];
  fdb_kvs_handle *apfStack_1d50 [5];
  timeval tStack_1d28;
  fdb_kvs_handle fStack_1d18;
  fdb_config fStack_1a18;
  fdb_kvs_handle **ppfStack_1920;
  btree *pbStack_1918;
  fdb_kvs_handle **ppfStack_1910;
  undefined8 *puStack_1908;
  undefined7 *puStack_1900;
  fdb_kvs_handle *pfStack_18f8;
  fdb_kvs_handle *pfStack_18e8;
  fdb_kvs_handle *pfStack_18e0;
  fdb_kvs_handle *pfStack_18d8;
  undefined7 uStack_18d0;
  undefined4 uStack_18c9;
  fdb_kvs_handle *pfStack_18c0;
  fdb_file_handle *pfStack_18b8;
  undefined1 auStack_18b0 [16];
  undefined7 uStack_18a0;
  undefined1 uStack_1899;
  undefined7 uStack_1898;
  undefined8 uStack_1890;
  void *pvStack_1888;
  undefined1 uStack_1880;
  timeval tStack_1878;
  undefined1 auStack_1868 [40];
  fdb_file_handle *pfStack_1840;
  undefined4 uStack_182c;
  fdb_iterator **ppfStack_1758;
  char *pcStack_1750;
  fdb_kvs_handle *pfStack_1748;
  char *pcStack_1740;
  char *pcStack_1738;
  code *pcStack_1730;
  fdb_iterator *pfStack_1720;
  fdb_iterator *pfStack_1718;
  fdb_kvs_handle *pfStack_1710;
  fdb_kvs_handle *pfStack_1708;
  fdb_file_handle *pfStack_1700;
  timeval tStack_16f8;
  fdb_kvs_config fStack_16e8;
  fdb_config fStack_16d0;
  char acStack_15d8 [256];
  char acStack_14d8 [264];
  fdb_kvs_handle *pfStack_13d0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_13c8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_13c0;
  fdb_kvs_handle *pfStack_13b8;
  fdb_kvs_handle *pfStack_13b0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_13a8;
  undefined1 auStack_1398 [16];
  fdb_kvs_handle *pfStack_1388;
  fdb_file_handle *pfStack_1380;
  fdb_kvs_handle *pfStack_1378;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1370 [11];
  undefined1 auStack_1318 [40];
  fdb_kvs_handle fStack_12f0;
  fdb_config fStack_ff0;
  fdb_config *pfStack_ef8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_ef0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_ee8;
  fdb_doc *pfStack_ee0;
  btree *pbStack_ed8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_ed0;
  undefined1 auStack_eb8 [24];
  fdb_file_handle *pfStack_ea0;
  undefined1 auStack_e98 [48];
  timeval tStack_e68;
  fdb_doc *apfStack_e58 [24];
  long lStack_d98;
  long lStack_d68;
  fdb_config fStack_b38;
  fdb_doc *pfStack_a40;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_a38;
  fdb_doc *pfStack_a30;
  btree *pbStack_a28;
  undefined1 auStack_a10 [24];
  fdb_file_handle *pfStack_9f8;
  fdb_doc *apfStack_9f0 [6];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_9c0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_9b8;
  timeval tStack_998;
  fdb_doc afStack_988 [3];
  char acStack_870 [256];
  char acStack_770 [256];
  fdb_config fStack_670;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_578;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_570;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_568;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_560;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_558;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_550;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_538;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_530;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_528;
  fdb_iterator *local_520;
  fdb_iterator *local_518;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_510;
  fdb_file_handle *local_508;
  fdb_kvs_handle *local_500;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_4f8 [11];
  fdb_kvs_config local_4a0;
  timeval local_488;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_478 [10];
  char local_428 [256];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_328 [32];
  char local_228 [256];
  fdb_config local_128;
  
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11832a;
  gettimeofday(&local_488,(__timezone_ptr_t)0x0);
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11832f;
  memleak_start();
  local_538.end_seqnum = 0;
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118340;
  system("rm -rf  iterator_test* > errorlog.txt");
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118350;
  fdb_get_default_config();
  aVar5.end_seqnum = (fdb_seqnum_t)&local_4a0;
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118360;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.seqtree_opt = '\x01';
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  aVar9.end_seqnum = (fdb_seqnum_t)&local_508;
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118392;
  fdb_open((fdb_file_handle **)aVar9,"./iterator_test1",&local_128);
  ptr_handle = &local_510;
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1183a5;
  fdb_kvs_open_default(local_508,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)aVar5);
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1183bb;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_510,logCallbackFunc,
                     "reverse_sequence_iterator_kvs_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1183e1;
    fVar3 = fdb_kvs_open(local_508,&local_500,"kv2",&local_4a0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118bf8;
    unaff_R12.end_seqnum = 0;
    ptr_handle = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x0;
    do {
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118409;
      sprintf(local_228,"kEy%d",(ulong)ptr_handle & 0xffffffff);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118421;
      sprintf((char *)&local_328[0].end_seqnum,"mEta%d",(ulong)ptr_handle & 0xffffffff);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118439;
      sprintf(local_428,"bOdy%d",(ulong)ptr_handle & 0xffffffff);
      aVar9.end_seqnum = (long)aaStack_478 + unaff_R12.end_seqnum;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11844c;
      unaff_R13.end_seqnum = strlen(local_228);
      unaff_RBP = local_328;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11845f;
      aVar5.end_seqnum = strlen((char *)&unaff_RBP->end_seqnum);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11846f;
      sVar6 = strlen(local_428);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118494;
      fdb_doc_create((fdb_doc **)aVar9,local_228,unaff_R13.end_keylen,unaff_RBP,aVar5.end_keylen,
                     local_428,sVar6);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1184a6;
      fVar3 = fdb_set(local_500,(fdb_doc *)aaStack_478[(long)ptr_handle]);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bb4;
        reverse_sequence_iterator_kvs_test();
        goto LAB_00118bb4;
      }
      ptr_handle = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)((long)ptr_handle + 1);
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (ptr_handle != (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0xa);
    lVar22 = 0;
    uVar28 = 0;
    do {
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1184df;
      sprintf(local_228,"key%d",uVar28 & 0xffffffff);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1184f7;
      sprintf((char *)&local_328[0].end_seqnum,"meta%d",uVar28 & 0xffffffff);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11850f;
      sprintf(local_428,"body%d",uVar28 & 0xffffffff);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11851f;
      sVar6 = strlen(local_228);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118532;
      sVar7 = strlen((char *)&local_328[0].end_seqnum);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118542;
      sVar8 = strlen(local_428);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118567;
      fdb_doc_create((fdb_doc **)((long)local_4f8 + lVar22),local_228,sVar6,local_328,sVar7,
                     local_428,sVar8);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118576;
      fdb_set((fdb_kvs_handle *)local_510,(fdb_doc *)local_4f8[uVar28]);
      lVar22 = lVar22 + 0x10;
      bVar29 = uVar28 < 8;
      uVar28 = uVar28 + 2;
    } while (bVar29);
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11859a;
    fdb_commit(local_508,'\x01');
    unaff_R13.end_seqnum = 8;
    aVar25.end_seqnum = 1;
    do {
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1185c2;
      sprintf(local_228,"key%d",aVar25.end_seqnum & 0xffffffff);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1185db;
      sprintf((char *)&local_328[0].end_seqnum,"meta%d",aVar25.end_seqnum & 0xffffffff);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1185f4;
      sprintf(local_428,"body%d",aVar25.end_seqnum & 0xffffffff);
      unaff_R12.end_seqnum = (long)local_4f8 + unaff_R13.end_seqnum;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118604;
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)strlen(local_228);
      ptr_handle = local_328;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118617;
      aVar9.end_seqnum = strlen((char *)&ptr_handle->end_seqnum);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118627;
      sVar6 = strlen(local_428);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11864c;
      fdb_doc_create((fdb_doc **)unaff_R12,local_228,(size_t)unaff_RBP,ptr_handle,aVar9.end_keylen,
                     local_428,sVar6);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11865b;
      fdb_set((fdb_kvs_handle *)local_510,(fdb_doc *)local_4f8[aVar25.end_seqnum]);
      aVar5.end_seqnum = aVar25.end_seqnum + 2;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 0x10;
      bVar29 = aVar25.end_seqnum < (fdb_kvs_handle *)0x8;
      aVar25.end_seqnum = aVar5.end_seqnum;
    } while (bVar29);
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11867c;
    fdb_commit(local_508,'\0');
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118692;
    fVar3 = fdb_iterator_sequence_init((fdb_kvs_handle *)local_510,&local_520,0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118bfd;
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x0;
    ptr_handle = &local_538;
    aVar5.end_seqnum = (fdb_seqnum_t)&local_528;
    do {
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1186b3;
      fdb_iterator_get(local_520,(fdb_doc **)ptr_handle);
      unaff_R13 = local_538;
      unaff_R12.end_seqnum = (long)local_4f8 + (long)unaff_RBP;
      aVar9.end_seqnum = *unaff_R12.end_seqnum;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1186d5;
      iVar4 = bcmp(*(kvs_ops_stat **)(local_538.end_seqnum + 0x20),
                   (fdb_file_handle *)
                   (((atomic<unsigned_long> *)(aVar9.end_seqnum + 0x20))->
                   super___atomic_base<unsigned_long>)._M_i,*(size_t *)local_538);
      if (iVar4 != 0) {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118745;
        reverse_sequence_iterator_kvs_test();
        unaff_R13 = local_530;
        aVar9 = local_528;
      }
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1186ea;
      iVar4 = bcmp(*(btree **)(unaff_R13.end_seqnum + 0x38),
                   *(fdb_file_handle **)(aVar9.end_seqnum + 0x38),
                   (size_t)*(fdb_custom_cmp_variable *)(unaff_R13.end_seqnum + 8));
      if (iVar4 != 0) {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118764;
        reverse_sequence_iterator_kvs_test();
        unaff_R13 = local_530;
        aVar9 = local_528;
      }
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1186ff;
      iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(unaff_R13.end_seqnum + 0x40))
                   ->seqtree,
                   ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar9.end_seqnum + 0x40))->
                   seqtree,(size_t)*(void **)(unaff_R13.end_seqnum + 0x10));
      if (iVar4 != 0) {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118781;
        reverse_sequence_iterator_kvs_test();
        unaff_R13 = local_528;
      }
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11870b;
      fdb_doc_free((fdb_doc *)unaff_R13);
      local_538.end_seqnum = 0;
      if ((int)unaff_RBP == 0x40) goto LAB_00118794;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118723;
      fVar3 = fdb_iterator_next(local_520);
      unaff_RBP = unaff_RBP + 2;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_RBP == 0x50) {
LAB_00118794:
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1187aa;
      fVar3 = fdb_iterator_sequence_init(local_500,&local_518,0,0,0);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118c02;
      ptr_handle = &local_538;
      do {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1187c4;
        fVar3 = fdb_iterator_get(local_518,(fdb_doc **)ptr_handle);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118bb4;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1187d6;
        fdb_doc_free((fdb_doc *)local_538);
        local_538.end_seqnum = 0;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1187e9;
        fVar3 = fdb_iterator_next(local_518);
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1187fd;
      fdb_commit(local_508,'\x01');
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118807;
      fVar3 = fdb_iterator_prev(local_520);
      if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00118be9:
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bee;
        reverse_sequence_iterator_kvs_test();
LAB_00118bee:
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bf3;
        reverse_sequence_iterator_kvs_test();
        goto LAB_00118bf3;
      }
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x4;
      ptr_handle = local_4f8 + 6;
      aVar5.end_seqnum = (fdb_seqnum_t)&local_538;
      aVar9.end_seqnum = (fdb_seqnum_t)&local_528;
      do {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118834;
        fVar3 = fdb_iterator_get(local_520,(fdb_doc **)aVar5);
        aVar25 = local_538;
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118bb9;
        unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ptr_handle->end_seqnum;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118856;
        iVar4 = bcmp(*(kvs_ops_stat **)(local_538.end_seqnum + 0x20),
                     *(kvs_ops_stat **)(unaff_R12.end_seqnum + 0x20),*(size_t *)local_538);
        if (iVar4 != 0) {
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1188c5;
          reverse_sequence_iterator_kvs_test();
          unaff_R12 = local_528;
          aVar25 = local_530;
        }
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11886c;
        iVar4 = bcmp(*(btree **)(aVar25.end_seqnum + 0x38),*(btree **)(unaff_R12.end_seqnum + 0x38),
                     (size_t)*(fdb_custom_cmp_variable *)(aVar25.end_seqnum + 8));
        if (iVar4 != 0) {
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1188e4;
          reverse_sequence_iterator_kvs_test();
          unaff_R12 = local_528;
          aVar25 = local_530;
        }
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118882;
        iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar25.end_seqnum + 0x40))->
                     seqtree,((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             (unaff_R12.end_seqnum + 0x40))->seqtree,
                     (size_t)*(void **)(aVar25.end_seqnum + 0x10));
        unaff_R13 = aVar25;
        if (iVar4 != 0) {
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1188fe;
          reverse_sequence_iterator_kvs_test();
          unaff_R13 = local_528;
        }
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11888e;
        fdb_doc_free((fdb_doc *)unaff_R13);
        local_538.end_seqnum = 0;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1188a1;
        fVar3 = fdb_iterator_prev(local_520);
        ptr_handle = ptr_handle + -2;
        uVar19 = (int)unaff_RBP - 1;
        unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ulong)uVar19;
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar19 != 0) goto LAB_00118be9;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118917;
      fdb_iterator_close(local_520);
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118921;
      fVar3 = fdb_iterator_prev(local_518);
      if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00118bee;
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0xa;
      ptr_handle = aaStack_478 + 9;
      aVar5.end_seqnum = (fdb_seqnum_t)&local_538;
      aVar9.end_seqnum = (fdb_seqnum_t)&local_528;
      do {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11894e;
        fVar3 = fdb_iterator_get(local_518,(fdb_doc **)aVar5);
        aVar25 = local_538;
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118bbe;
        unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ptr_handle->end_seqnum;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118970;
        iVar4 = bcmp(*(kvs_ops_stat **)(local_538.end_seqnum + 0x20),
                     *(kvs_ops_stat **)(unaff_R12.end_seqnum + 0x20),*(size_t *)local_538);
        if (iVar4 != 0) {
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1189df;
          reverse_sequence_iterator_kvs_test();
          unaff_R12 = local_528;
          aVar25 = local_530;
        }
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118986;
        iVar4 = bcmp(*(btree **)(aVar25.end_seqnum + 0x38),*(btree **)(unaff_R12.end_seqnum + 0x38),
                     (size_t)*(fdb_custom_cmp_variable *)(aVar25.end_seqnum + 8));
        if (iVar4 != 0) {
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1189fe;
          reverse_sequence_iterator_kvs_test();
          unaff_R12 = local_528;
          aVar25 = local_530;
        }
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11899c;
        iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar25.end_seqnum + 0x40))->
                     seqtree,((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             (unaff_R12.end_seqnum + 0x40))->seqtree,
                     (size_t)*(void **)(aVar25.end_seqnum + 0x10));
        unaff_R13 = aVar25;
        if (iVar4 != 0) {
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118a18;
          reverse_sequence_iterator_kvs_test();
          unaff_R13 = local_528;
        }
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1189a8;
        fdb_doc_free((fdb_doc *)unaff_R13);
        local_538.end_seqnum = 0;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1189bb;
        fVar3 = fdb_iterator_prev(local_518);
        ptr_handle = ptr_handle + -1;
        uVar19 = (int)unaff_RBP - 1;
        unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ulong)uVar19;
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar19 != 0) goto LAB_00118bee;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118a31;
      fdb_iterator_close(local_518);
      unaff_R13.end_seqnum = 0;
      paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118a4a;
      fVar3 = fdb_iterator_sequence_init((fdb_kvs_handle *)local_510,&local_520,0,0,0);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118c07;
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0xa;
      aVar25.end_seqnum = aVar5.end_seqnum;
      do {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118a66;
        fVar3 = fdb_iterator_get(local_520,(fdb_doc **)&local_538);
        aVar5 = local_538;
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118bce;
        aVar9 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(local_538.end_seqnum + 0x20);
        iVar24 = (int)unaff_R13.end_seqnum;
        ptr_handle = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)local_4f8[iVar24].end_seqnum;
        unaff_R12 = ptr_handle[4];
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118a91;
        iVar4 = bcmp((void *)aVar9,(void *)unaff_R12,*(size_t *)local_538);
        if (iVar4 != 0) goto LAB_00118bc3;
        aVar9 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar5.end_seqnum + 0x38);
        unaff_R12 = ptr_handle[7];
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118ab0;
        iVar4 = bcmp((void *)aVar9,(void *)unaff_R12,
                     (size_t)*(fdb_custom_cmp_variable *)(aVar5.end_seqnum + 8));
        if (iVar4 != 0) goto LAB_00118bde;
        aVar9 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar5.end_seqnum + 0x40);
        unaff_R12 = ptr_handle[8];
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118acf;
        iVar4 = bcmp((void *)aVar9,(void *)unaff_R12,(size_t)*(void **)(aVar5.end_seqnum + 0x10));
        if (iVar4 != 0) goto LAB_00118bd3;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118adf;
        fdb_doc_free((fdb_doc *)aVar5);
        local_538.end_seqnum = 0;
        uVar19 = iVar24 + 2;
        if (iVar24 == 8) {
          uVar19 = 1;
        }
        ptr_handle = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ulong)uVar19;
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b02;
        fVar3 = fdb_iterator_next(local_520);
        uVar20 = (int)unaff_RBP - 1;
        unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ulong)uVar20;
        unaff_R13.end_seqnum._4_4_ = 0;
        unaff_R13.end_seqnum._0_4_ = uVar19;
        aVar25 = aVar5;
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar20 == 0) {
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b22;
        fdb_iterator_close(local_520);
        lVar22 = 0;
        do {
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b2e;
          fdb_doc_free((fdb_doc *)local_4f8[lVar22]);
          paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b3b;
          fdb_doc_free((fdb_doc *)aaStack_478[lVar22]);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 10);
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b4e;
        fdb_kvs_close((fdb_kvs_handle *)local_510);
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b58;
        fdb_kvs_close(local_500);
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b62;
        fdb_close(local_508);
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b67;
        fdb_shutdown();
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b6c;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (reverse_sequence_iterator_kvs_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118b9d;
        fprintf(_stderr,pcVar21,"reverse sequence iterator kvs test");
        return;
      }
      goto LAB_00118c0c;
    }
  }
  else {
LAB_00118bf3:
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bf8;
    reverse_sequence_iterator_kvs_test();
LAB_00118bf8:
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bfd;
    reverse_sequence_iterator_kvs_test();
LAB_00118bfd:
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118c02;
    reverse_sequence_iterator_kvs_test();
LAB_00118c02:
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118c07;
    reverse_sequence_iterator_kvs_test();
LAB_00118c07:
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118c0c;
    reverse_sequence_iterator_kvs_test();
LAB_00118c0c:
    paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118c11;
    reverse_sequence_iterator_kvs_test();
  }
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)reverse_iterator_test;
  reverse_sequence_iterator_kvs_test();
  pbStack_a28 = (btree *)0x118c39;
  paStack_578 = ptr_handle;
  aStack_570 = unaff_R12;
  aStack_568 = unaff_R13;
  aStack_560 = aVar5;
  aStack_558 = aVar9;
  paStack_550 = unaff_RBP;
  gettimeofday(&tStack_998,(__timezone_ptr_t)0x0);
  pbStack_a28 = (btree *)0x118c3e;
  memleak_start();
  auStack_a10._0_8_ = (fdb_doc *)0x0;
  pbStack_a28 = (btree *)0x118c4f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pbStack_a28 = (btree *)0x118c5f;
  fdb_get_default_config();
  doc_00 = afStack_988;
  pbStack_a28 = (btree *)0x118c6f;
  fdb_get_default_kvs_config();
  fStack_670.buffercache_size = 0;
  fStack_670.wal_threshold = 0x400;
  fStack_670.flags = 1;
  fStack_670.compaction_threshold = '\0';
  pbVar10 = (btree *)&pfStack_9f8;
  pbStack_a28 = (btree *)0x118c9d;
  fdb_open((fdb_file_handle **)pbVar10,"./iterator_test1",&fStack_670);
  pfVar15 = (fdb_doc *)(auStack_a10 + 0x10);
  pbStack_a28 = (btree *)0x118cb0;
  fdb_kvs_open_default(pfStack_9f8,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)doc_00);
  pbStack_a28 = (btree *)0x118cc6;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_a10._16_8_,logCallbackFunc,"reverse_iterator_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar22 = 0;
    uVar28 = 0;
    do {
      pbStack_a28 = (btree *)0x118cee;
      sprintf(acStack_770,"key%d",uVar28 & 0xffffffff);
      pbStack_a28 = (btree *)0x118d06;
      sprintf(acStack_870,"meta%d",uVar28 & 0xffffffff);
      pbStack_a28 = (btree *)0x118d1e;
      sprintf((char *)&afStack_988[0].size_ondisk,"body%d",uVar28 & 0xffffffff);
      pbStack_a28 = (btree *)0x118d2e;
      sVar6 = strlen(acStack_770);
      pbStack_a28 = (btree *)0x118d41;
      sVar7 = strlen(acStack_870);
      pbStack_a28 = (btree *)0x118d51;
      sVar8 = strlen((char *)&afStack_988[0].size_ondisk);
      pbStack_a28 = (btree *)0x118d76;
      fdb_doc_create((fdb_doc **)((long)apfStack_9f0 + lVar22),acStack_770,sVar6,acStack_870,sVar7,
                     &afStack_988[0].size_ondisk,sVar8);
      pbStack_a28 = (btree *)0x118d85;
      fdb_set((fdb_kvs_handle *)auStack_a10._16_8_,apfStack_9f0[uVar28]);
      lVar22 = lVar22 + 0x10;
      bVar29 = uVar28 < 8;
      uVar28 = uVar28 + 2;
    } while (bVar29);
    pbStack_a28 = (btree *)0x118da9;
    fdb_commit(pfStack_9f8,'\x01');
    lVar22 = 8;
    pfVar15 = (fdb_doc *)0x1;
    do {
      pbStack_a28 = (btree *)0x118dd1;
      sprintf(acStack_770,"key%d",(ulong)pfVar15 & 0xffffffff);
      pbStack_a28 = (btree *)0x118dea;
      sprintf(acStack_870,"meta%d",(ulong)pfVar15 & 0xffffffff);
      pbStack_a28 = (btree *)0x118e03;
      sprintf((char *)&afStack_988[0].size_ondisk,"body%d",(ulong)pfVar15 & 0xffffffff);
      unaff_R12.end_seqnum = (long)apfStack_9f0 + lVar22;
      pbStack_a28 = (btree *)0x118e13;
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)strlen(acStack_770);
      pbStack_a28 = (btree *)0x118e26;
      pbVar10 = (btree *)strlen(acStack_870);
      pbStack_a28 = (btree *)0x118e36;
      sVar6 = strlen((char *)&afStack_988[0].size_ondisk);
      pbStack_a28 = (btree *)0x118e5b;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_770,(size_t)unaff_RBP,acStack_870,(size_t)pbVar10
                     ,&afStack_988[0].size_ondisk,sVar6);
      pbStack_a28 = (btree *)0x118e6a;
      fdb_set((fdb_kvs_handle *)auStack_a10._16_8_,apfStack_9f0[(long)pfVar15]);
      pbVar2 = (bool *)&pfVar15->keylen;
      lVar22 = lVar22 + 0x10;
      bVar29 = pfVar15 < (fdb_doc *)0x8;
      pfVar15 = (fdb_doc *)(pbVar2 + 2);
    } while (bVar29);
    unaff_R13.end_seqnum = 0;
    pbStack_a28 = (btree *)0x118e8e;
    fdb_commit(pfStack_9f8,'\0');
    pbStack_a28 = (btree *)0x118eae;
    fdb_iterator_init((fdb_kvs_handle *)auStack_a10._16_8_,(fdb_iterator **)(auStack_a10 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    pfVar15 = (fdb_doc *)auStack_a10;
    pfVar14 = (fdb_doc *)(pbVar2 + 2);
    do {
      pbStack_a28 = (btree *)0x118ec0;
      fVar3 = fdb_iterator_get((fdb_iterator *)auStack_a10._8_8_,(fdb_doc **)pfVar15);
      doc_00 = (fdb_doc *)auStack_a10._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00119395:
        pbStack_a28 = (btree *)0x11939a;
        reverse_iterator_test();
        doc_00 = pfVar14;
LAB_0011939a:
        pbStack_a28 = (btree *)0x1193a5;
        reverse_iterator_test();
LAB_001193a5:
        pbStack_a28 = (btree *)0x1193b0;
        reverse_iterator_test();
        goto LAB_001193b0;
      }
      pbVar10 = *(btree **)(auStack_a10._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)apfStack_9f0[unaff_R13.end_seqnum]
      ;
      unaff_R12 = unaff_RBP[4];
      pbStack_a28 = (btree *)0x118ee8;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)auStack_a10._0_8_);
      pfVar14 = doc_00;
      if (iVar4 != 0) {
        pbStack_a28 = (btree *)0x119395;
        reverse_iterator_test();
        goto LAB_00119395;
      }
      pbVar10 = *(btree **)((long)doc_00 + 0x38);
      unaff_R12 = unaff_RBP[7];
      pbStack_a28 = (btree *)0x118f07;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 8));
      if (iVar4 != 0) goto LAB_001193a5;
      pbVar10 = *(btree **)((long)doc_00 + 0x40);
      unaff_R12 = unaff_RBP[8];
      pbStack_a28 = (btree *)0x118f26;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 0x10));
      if (iVar4 != 0) goto LAB_0011939a;
      pbStack_a28 = (btree *)0x118f36;
      fdb_doc_free(doc_00);
      auStack_a10._0_8_ = (fdb_doc *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      pbStack_a28 = (btree *)0x118f4c;
      fVar3 = fdb_iterator_next((fdb_iterator *)auStack_a10._8_8_);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xa) goto LAB_00119431;
    pbStack_a28 = (btree *)0x118f69;
    fVar3 = fdb_iterator_prev((fdb_iterator *)auStack_a10._8_8_);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00119427:
      pbStack_a28 = (btree *)0x11942c;
      reverse_iterator_test();
      goto LAB_0011942c;
    }
    unaff_R13.end_seqnum = 4;
    pfVar15 = (fdb_doc *)auStack_a10;
    do {
      pbStack_a28 = (btree *)0x118f8a;
      fVar3 = fdb_iterator_get((fdb_iterator *)auStack_a10._8_8_,(fdb_doc **)pfVar15);
      doc_00 = (fdb_doc *)auStack_a10._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001193fc;
      pbVar10 = *(btree **)(auStack_a10._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                  apfStack_9f0[(long)(unaff_R13.end_seqnum + 5)];
      unaff_R12 = unaff_RBP[4];
      pbStack_a28 = (btree *)0x118fb2;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)auStack_a10._0_8_);
      if (iVar4 != 0) goto LAB_0011940c;
      pbVar10 = *(btree **)((long)doc_00 + 0x38);
      unaff_R12 = unaff_RBP[7];
      pbStack_a28 = (btree *)0x118fd1;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 8));
      if (iVar4 != 0) goto LAB_00119401;
      pbVar10 = *(btree **)((long)doc_00 + 0x40);
      unaff_R12 = unaff_RBP[8];
      pbStack_a28 = (btree *)0x118ff0;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 0x10));
      if (iVar4 != 0) goto LAB_00119417;
      pbStack_a28 = (btree *)0x119000;
      fdb_doc_free(doc_00);
      auStack_a10._0_8_ = (fdb_doc *)0x0;
      bVar29 = (fdb_kvs_handle *)unaff_R13.end_seqnum == (fdb_kvs_handle *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum - 1;
      if (bVar29) goto LAB_0011902b;
      pbStack_a28 = (btree *)0x119019;
      fVar3 = fdb_iterator_prev((fdb_iterator *)auStack_a10._8_8_);
      pfVar14 = doc_00;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0x0) goto LAB_00119427;
LAB_0011902b:
    pbStack_a28 = (btree *)0x119035;
    fVar3 = fdb_iterator_next((fdb_iterator *)auStack_a10._8_8_);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00119436;
    pbStack_a28 = (btree *)0x11904d;
    fVar3 = fdb_iterator_get((fdb_iterator *)auStack_a10._8_8_,(fdb_doc **)auStack_a10);
    pfVar14 = (fdb_doc *)auStack_a10._0_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943b;
    doc_00 = *(fdb_doc **)(auStack_a10._0_8_ + 0x20);
    pbVar10 = *(btree **)(aStack_9c0.end_seqnum + 0x20);
    pbStack_a28 = (btree *)0x119076;
    iVar4 = bcmp(doc_00,pbVar10,*(size_t *)auStack_a10._0_8_);
    unaff_R12 = aStack_9c0;
    if (iVar4 != 0) goto LAB_00119440;
    doc_00 = *(fdb_doc **)((long)pfVar14 + 0x38);
    pbVar10 = *(btree **)(aStack_9c0.end_seqnum + 0x38);
    pbStack_a28 = (btree *)0x119096;
    iVar4 = bcmp(doc_00,pbVar10,*(size_t *)((long)pfVar14 + 8));
    if (iVar4 != 0) goto LAB_0011944b;
    doc_00 = *(fdb_doc **)((long)pfVar14 + 0x40);
    pbVar10 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aStack_9c0.end_seqnum + 0x40))->
              seqtree;
    pbStack_a28 = (btree *)0x1190b6;
    iVar4 = bcmp(doc_00,pbVar10,*(size_t *)((long)pfVar14 + 0x10));
    if (iVar4 != 0) goto LAB_00119456;
    pbStack_a28 = (btree *)0x1190c6;
    fdb_doc_free(pfVar14);
    auStack_a10._0_8_ = (fdb_doc *)0x0;
    pbStack_a28 = (btree *)0x1190d9;
    fVar3 = fdb_iterator_next((fdb_iterator *)auStack_a10._8_8_);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00119461;
    pbStack_a28 = (btree *)0x1190f1;
    fVar3 = fdb_iterator_get((fdb_iterator *)auStack_a10._8_8_,(fdb_doc **)auStack_a10);
    pfVar15 = (fdb_doc *)auStack_a10._0_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    doc_00 = *(fdb_doc **)(auStack_a10._0_8_ + 0x20);
    pbVar10 = *(btree **)(aStack_9b8.end_seqnum + 0x20);
    pbStack_a28 = (btree *)0x11911a;
    iVar4 = bcmp(doc_00,pbVar10,*(size_t *)auStack_a10._0_8_);
    unaff_R12 = aStack_9b8;
    if (iVar4 != 0) goto LAB_0011946b;
    doc_00 = *(fdb_doc **)((long)pfVar15 + 0x38);
    pbVar10 = *(btree **)(aStack_9b8.end_seqnum + 0x38);
    pbStack_a28 = (btree *)0x11913a;
    iVar4 = bcmp(doc_00,pbVar10,*(size_t *)((long)pfVar15 + 8));
    if (iVar4 != 0) goto LAB_00119476;
    doc_00 = *(fdb_doc **)((long)pfVar15 + 0x40);
    pbVar10 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aStack_9b8.end_seqnum + 0x40))->
              seqtree;
    pbStack_a28 = (btree *)0x11915a;
    iVar4 = bcmp(doc_00,pbVar10,*(size_t *)((long)pfVar15 + 0x10));
    if (iVar4 != 0) goto LAB_00119481;
    pbStack_a28 = (btree *)0x11916a;
    fdb_doc_free(pfVar15);
    auStack_a10._0_8_ = (fdb_doc *)0x0;
    pbStack_a28 = (btree *)0x11917d;
    fVar3 = fdb_iterator_prev((fdb_iterator *)auStack_a10._8_8_);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00119422:
      pbStack_a28 = (btree *)0x119427;
      reverse_iterator_test();
      goto LAB_00119427;
    }
    unaff_R13.end_seqnum = 6;
    pfVar15 = (fdb_doc *)auStack_a10;
    pfVar14 = doc_00;
    do {
      pbStack_a28 = (btree *)0x11919e;
      fVar3 = fdb_iterator_get((fdb_iterator *)auStack_a10._8_8_,(fdb_doc **)pfVar15);
      doc_00 = (fdb_doc *)auStack_a10._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001193bb;
      pbVar10 = *(btree **)(auStack_a10._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)apfStack_9f0[unaff_R13.end_seqnum]
      ;
      unaff_R12 = unaff_RBP[4];
      pbStack_a28 = (btree *)0x1191c6;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)auStack_a10._0_8_);
      if (iVar4 != 0) goto LAB_001193b0;
      pbVar10 = *(btree **)((long)doc_00 + 0x38);
      unaff_R12 = unaff_RBP[7];
      pbStack_a28 = (btree *)0x1191e5;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 8));
      if (iVar4 != 0) goto LAB_001193cb;
      pbVar10 = *(btree **)((long)doc_00 + 0x40);
      unaff_R12 = unaff_RBP[8];
      pbStack_a28 = (btree *)0x119204;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 0x10));
      if (iVar4 != 0) goto LAB_001193c0;
      pbStack_a28 = (btree *)0x119214;
      fdb_doc_free(doc_00);
      auStack_a10._0_8_ = (fdb_doc *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum - 1;
      pbStack_a28 = (btree *)0x11922a;
      fVar3 = fdb_iterator_prev((fdb_iterator *)auStack_a10._8_8_);
      pfVar14 = doc_00;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xffffffffffffffff)
    goto LAB_00119422;
    pbStack_a28 = (btree *)0x119247;
    fVar3 = fdb_iterator_next((fdb_iterator *)auStack_a10._8_8_);
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
      pbStack_a28 = (btree *)0x119256;
      reverse_iterator_test();
    }
    unaff_R13.end_seqnum = 0;
    pfVar15 = (fdb_doc *)auStack_a10;
    do {
      pbStack_a28 = (btree *)0x11926b;
      fVar3 = fdb_iterator_get((fdb_iterator *)auStack_a10._8_8_,(fdb_doc **)pfVar15);
      doc_00 = (fdb_doc *)auStack_a10._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001193e1;
      pbVar10 = *(btree **)(auStack_a10._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)apfStack_9f0[unaff_R13.end_seqnum]
      ;
      unaff_R12 = unaff_RBP[4];
      pbStack_a28 = (btree *)0x119293;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)auStack_a10._0_8_);
      if (iVar4 != 0) goto LAB_001193d6;
      pbVar10 = *(btree **)((long)doc_00 + 0x38);
      unaff_R12 = unaff_RBP[7];
      pbStack_a28 = (btree *)0x1192b2;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 8));
      if (iVar4 != 0) goto LAB_001193f1;
      pbVar10 = *(btree **)((long)doc_00 + 0x40);
      unaff_R12 = unaff_RBP[8];
      pbStack_a28 = (btree *)0x1192d1;
      iVar4 = bcmp(pbVar10,(void *)unaff_R12,*(size_t *)((long)doc_00 + 0x10));
      if (iVar4 != 0) goto LAB_001193e6;
      pbStack_a28 = (btree *)0x1192e1;
      fdb_doc_free(doc_00);
      auStack_a10._0_8_ = (fdb_doc *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      pbStack_a28 = (btree *)0x1192f7;
      fVar3 = fdb_iterator_next((fdb_iterator *)auStack_a10._8_8_);
      pfVar14 = doc_00;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum == (fdb_kvs_handle *)0xa) {
      pbStack_a28 = (btree *)0x119314;
      fdb_iterator_close((fdb_iterator *)auStack_a10._8_8_);
      pbStack_a28 = (btree *)0x11931e;
      fdb_kvs_close((fdb_kvs_handle *)auStack_a10._16_8_);
      pbStack_a28 = (btree *)0x119328;
      fdb_close(pfStack_9f8);
      lVar22 = 0;
      do {
        pbStack_a28 = (btree *)0x119334;
        fdb_doc_free(apfStack_9f0[lVar22]);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      pbStack_a28 = (btree *)0x119342;
      fdb_shutdown();
      pbStack_a28 = (btree *)0x119347;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (reverse_iterator_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pbStack_a28 = (btree *)0x119378;
      fprintf(_stderr,pcVar21,"reverse iterator test");
      return;
    }
  }
  else {
LAB_0011942c:
    pbStack_a28 = (btree *)0x119431;
    reverse_iterator_test();
LAB_00119431:
    pbStack_a28 = (btree *)0x119436;
    reverse_iterator_test();
LAB_00119436:
    pbStack_a28 = (btree *)0x11943b;
    reverse_iterator_test();
LAB_0011943b:
    pfVar14 = pfVar15;
    pbStack_a28 = (btree *)0x119440;
    reverse_iterator_test();
LAB_00119440:
    pbStack_a28 = (btree *)0x11944b;
    reverse_iterator_test();
LAB_0011944b:
    pbStack_a28 = (btree *)0x119456;
    reverse_iterator_test();
LAB_00119456:
    pbStack_a28 = (btree *)0x119461;
    reverse_iterator_test();
LAB_00119461:
    pbStack_a28 = (btree *)0x119466;
    reverse_iterator_test();
LAB_00119466:
    pfVar15 = pfVar14;
    pbStack_a28 = (btree *)0x11946b;
    reverse_iterator_test();
LAB_0011946b:
    pbStack_a28 = (btree *)0x119476;
    reverse_iterator_test();
LAB_00119476:
    pbStack_a28 = (btree *)0x119481;
    reverse_iterator_test();
LAB_00119481:
    pbStack_a28 = (btree *)0x11948c;
    reverse_iterator_test();
  }
  pbStack_a28 = (btree *)reverse_seek_to_max_nokey;
  reverse_iterator_test();
  paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1194ab;
  pfStack_a40 = pfVar15;
  aStack_a38 = unaff_R12;
  pfStack_a30 = doc_00;
  pbStack_a28 = pbVar10;
  gettimeofday(&tStack_e68,(__timezone_ptr_t)0x0);
  paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1194b0;
  memleak_start();
  paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1194bc;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcVar21 = (char *)&fStack_b38;
  paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1194cc;
  fdb_get_default_config();
  paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1194d6;
  fdb_get_default_kvs_config();
  fStack_b38.buffercache_size = 0;
  paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1194f2;
  fVar3 = fdb_open(&pfStack_ea0,"./iterator_test1",(fdb_config *)pcVar21);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11950e;
    fVar3 = fdb_kvs_open_default
                      (pfStack_ea0,(fdb_kvs_handle **)(auStack_eb8 + 8),
                       (fdb_kvs_config *)(auStack_e98 + 0x18));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119783;
    pcVar21 = "doc-%03d";
    doc_00 = (fdb_doc *)auStack_e98;
    unaff_R12.end_seqnum = 0;
    uVar28 = 0;
    do {
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119538;
      sprintf((char *)doc_00,"doc-%03d",uVar28 & 0xffffffff);
      auStack_e98._7_2_ = 0;
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119564;
      fdb_doc_create((fdb_doc **)((long)apfStack_e58 + unaff_R12.end_seqnum),doc_00,10,(void *)0x0,0
                     ,doc_00,10);
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119573;
      fdb_set((fdb_kvs_handle *)auStack_eb8._8_8_,apfStack_e58[uVar28]);
      uVar28 = uVar28 + 1;
      unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
    } while (uVar28 != 100);
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11958c;
    fdb_commit(pfStack_ea0,'\0');
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1195a4;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_eb8._8_8_,logCallbackFunc,
                       "reverse_seek_to_max_nokey");
    pbVar10 = (btree *)0x64;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119788;
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1195e0;
    fVar3 = fdb_iterator_init((fdb_kvs_handle *)auStack_eb8._8_8_,(fdb_iterator **)auStack_eb8,
                              *(void **)(lStack_d98 + 0x20),10,"doc-029b",10,2);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011978d;
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1195f2;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_eb8._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119792;
    pcVar21 = auStack_eb8 + 0x10;
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11961b;
    fdb_doc_create((fdb_doc **)pcVar21,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119628;
    fVar3 = fdb_iterator_get((fdb_iterator *)auStack_eb8._0_8_,(fdb_doc **)pcVar21);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119797;
    if (**(long **)(auStack_eb8._16_8_ + 0x20) != 0x3932302d636f64) goto LAB_0011979c;
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119651;
    fdb_doc_free((fdb_doc *)auStack_eb8._16_8_);
    pcVar21 = auStack_eb8;
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11965e;
    fdb_iterator_close((fdb_iterator *)auStack_eb8._0_8_);
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119690;
    fVar3 = fdb_iterator_init((fdb_kvs_handle *)auStack_eb8._8_8_,(fdb_iterator **)pcVar21,
                              "doc-024b",10,*(void **)(lStack_d68 + 0x20),10,2);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001197a4;
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1196a2;
    fVar3 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_eb8._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001197a9;
    pcVar21 = auStack_eb8 + 0x10;
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1196cb;
    fdb_doc_create((fdb_doc **)pcVar21,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1196d8;
    fVar3 = fdb_iterator_get((fdb_iterator *)auStack_eb8._0_8_,(fdb_doc **)pcVar21);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001197ae;
    if (**(long **)(auStack_eb8._16_8_ + 0x20) == 0x3532302d636f64) {
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119701;
      fdb_doc_free((fdb_doc *)auStack_eb8._16_8_);
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11970b;
      fdb_iterator_close((fdb_iterator *)auStack_eb8._0_8_);
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119715;
      fdb_kvs_close((fdb_kvs_handle *)auStack_eb8._8_8_);
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11971f;
      fdb_close(pfStack_ea0);
      lVar22 = 0;
      do {
        paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11972b;
        fdb_doc_free(apfStack_e58[lVar22]);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 100);
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119739;
      fdb_shutdown();
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11973e;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (reverse_seek_to_max_nokey()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11976f;
      fprintf(_stderr,pcVar21,"reverse seek to max non-existent key test");
      return;
    }
  }
  else {
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119783;
    reverse_seek_to_max_nokey();
LAB_00119783:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119788;
    reverse_seek_to_max_nokey();
LAB_00119788:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11978d;
    reverse_seek_to_max_nokey();
LAB_0011978d:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119792;
    reverse_seek_to_max_nokey();
LAB_00119792:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119797;
    reverse_seek_to_max_nokey();
LAB_00119797:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11979c;
    reverse_seek_to_max_nokey();
LAB_0011979c:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1197a4;
    reverse_seek_to_max_nokey();
LAB_001197a4:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1197a9;
    reverse_seek_to_max_nokey();
LAB_001197a9:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1197ae;
    reverse_seek_to_max_nokey();
LAB_001197ae:
    paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1197b3;
    reverse_seek_to_max_nokey();
  }
  paStack_ed0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)iterator_seek_wal_only_test;
  reverse_seek_to_max_nokey();
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1197de;
  pfStack_ef8 = (fdb_config *)pcVar21;
  aStack_ef0 = unaff_R12;
  aStack_ee8 = unaff_R13;
  pfStack_ee0 = doc_00;
  pbStack_ed8 = pbVar10;
  paStack_ed0 = unaff_RBP;
  gettimeofday((timeval *)(auStack_1318 + 0x18),(__timezone_ptr_t)0x0);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1197e3;
  memleak_start();
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1197f4;
  system("rm -rf  iterator_test* > errorlog.txt");
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119804;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)auStack_1318;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119814;
  fdb_get_default_kvs_config();
  fStack_ff0.buffercache_size = 0;
  fStack_ff0.wal_threshold = 0x400;
  fStack_ff0.flags = 1;
  fStack_ff0.compaction_threshold = '\0';
  pfVar23 = (fdb_kvs_handle *)&pfStack_1380;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119842;
  fdb_open((fdb_file_handle **)pfVar23,"./iterator_test1",&fStack_ff0);
  pfVar13 = (fdb_kvs_handle *)&pfStack_1388;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119855;
  fdb_kvs_open_default(pfStack_1380,(fdb_kvs_handle **)pfVar13,(fdb_kvs_config *)pfVar11);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11986b;
  fVar3 = fdb_set_log_callback(pfStack_1388,logCallbackFunc,"iterator_seek_wal_only_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a3ef;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119891;
  fVar3 = fdb_kvs_open(pfStack_1380,&pfStack_1378,"kv1",(fdb_kvs_config *)auStack_1318);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a3f4;
  unaff_R12.end_seqnum = 0;
  pfVar16 = (fdb_kvs_handle *)0x0;
  do {
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1198b9;
    sprintf((char *)&fStack_12f0,"kEy%d",(ulong)pfVar16 & 0xffffffff);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1198d1;
    sprintf((char *)&fStack_12f0.bub_ctx.handle,"mEta%d",(ulong)pfVar16 & 0xffffffff);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1198e9;
    sprintf((char *)&fStack_12f0.config.encryption_key,"bOdy%d",(ulong)pfVar16 & 0xffffffff);
    pfVar23 = (fdb_kvs_handle *)((long)aaStack_1370 + unaff_R12.end_seqnum);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1198f9;
    unaff_R13.end_seqnum = strlen((char *)&fStack_12f0);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)&fStack_12f0.bub_ctx.handle;
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11990c;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)&unaff_RBP->end_seqnum);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11991c;
    sVar6 = strlen((char *)&fStack_12f0.config.encryption_key);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119941;
    fdb_doc_create((fdb_doc **)pfVar23,&fStack_12f0,unaff_R13.end_keylen,unaff_RBP,(size_t)pfVar11,
                   &fStack_12f0.config.encryption_key,sVar6);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119950;
    fVar3 = fdb_set(pfStack_1378,(fdb_doc *)aaStack_1370[(long)pfVar16]);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3a3;
      iterator_seek_wal_only_test();
      goto LAB_0011a3a3;
    }
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119962;
    fdb_doc_free((fdb_doc *)aaStack_1370[(long)pfVar16]);
    pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
    unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
  } while (pfVar16 != (fdb_kvs_handle *)0xa);
  unaff_R12.end_seqnum = 0;
  uVar28 = 0;
  do {
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119993;
    sprintf((char *)&fStack_12f0,"key%d",uVar28 & 0xffffffff);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1199ab;
    sprintf((char *)&fStack_12f0.bub_ctx.handle,"meta%d",uVar28 & 0xffffffff);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1199c3;
    sprintf((char *)&fStack_12f0.config.encryption_key,"body%d",uVar28 & 0xffffffff);
    pfVar23 = (fdb_kvs_handle *)((long)aaStack_1370 + unaff_R12.end_seqnum);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1199d3;
    unaff_R13.end_seqnum = strlen((char *)&fStack_12f0);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)&fStack_12f0.bub_ctx.handle;
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1199e6;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)&unaff_RBP->end_seqnum);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x1199f6;
    sVar6 = strlen((char *)&fStack_12f0.config.encryption_key);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119a1b;
    fdb_doc_create((fdb_doc **)pfVar23,&fStack_12f0,unaff_R13.end_keylen,unaff_RBP,(size_t)pfVar11,
                   &fStack_12f0.config.encryption_key,sVar6);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119a2a;
    fdb_set(pfStack_1388,(fdb_doc *)aaStack_1370[uVar28]);
    uVar28 = uVar28 + 1;
    unaff_R12.end_seqnum = unaff_R12.end_seqnum + 8;
  } while (uVar28 != 10);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119a47;
  fdb_commit(pfStack_1380,'\0');
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119a6a;
  fdb_iterator_init(pfStack_1388,(fdb_iterator **)(auStack_1398 + 8),(void *)0x0,0,(void *)0x0,0,0);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119a77;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  aVar5 = aaStack_1370[0];
  pfVar16 = (fdb_kvs_handle *)auStack_1398._0_8_;
  pfVar13 = (fdb_kvs_handle *)(auStack_1398 + 8);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a3f9;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[0].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119aa0;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  if (iVar4 != 0) goto LAB_0011a3fe;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar16 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aVar5.end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119ac0;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a409;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar16 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar5.end_seqnum + 0x40))->seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119ae0;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a414;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119af0;
  fdb_doc_free((fdb_doc *)pfVar16);
  pfVar16 = (fdb_kvs_handle *)auStack_1398._8_8_;
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar11 = *(fdb_kvs_handle **)(aaStack_1370[2].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119b14;
  sVar6 = strlen((char *)&fStack_12f0);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119b24;
  fVar3 = fdb_iterator_seek((fdb_iterator *)pfVar16,pfVar11,sVar6,'\0');
  if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a41f;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119b3c;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  aVar9 = aaStack_1370[2];
  pfVar13 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a424;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[2].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119b65;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  if (iVar4 != 0) goto LAB_0011a429;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar13 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aVar9.end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119b85;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a434;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar9.end_seqnum + 0x40))->seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119ba5;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a43f;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119bb5;
  fdb_doc_free((fdb_doc *)pfVar13);
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119bc8;
  fVar3 = fdb_iterator_next((fdb_iterator *)auStack_1398._8_8_);
  if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a44a;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119be0;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  aVar5 = aaStack_1370[3];
  pfVar16 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a44f;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[3].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119c09;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  if (iVar4 != 0) goto LAB_0011a454;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar16 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aVar5.end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119c29;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a45f;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar16 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar5.end_seqnum + 0x40))->seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119c49;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a46a;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119c59;
  fdb_doc_free((fdb_doc *)pfVar16);
  pfVar16 = (fdb_kvs_handle *)auStack_1398._8_8_;
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar11 = *(fdb_kvs_handle **)(aaStack_1370[9].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119c7d;
  sVar6 = strlen((char *)&fStack_12f0);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119c8d;
  fVar3 = fdb_iterator_seek((fdb_iterator *)pfVar16,pfVar11,sVar6,'\0');
  if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a475;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119ca5;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  aVar9 = aaStack_1370[9];
  pfVar13 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a47a;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[9].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119cce;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  if (iVar4 != 0) goto LAB_0011a47f;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar13 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aVar9.end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119cee;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a48a;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar9.end_seqnum + 0x40))->seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119d0e;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a495;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119d1e;
  fdb_doc_free((fdb_doc *)pfVar13);
  pfVar13 = (fdb_kvs_handle *)auStack_1398._8_8_;
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar11 = *(fdb_kvs_handle **)(aaStack_1370[0].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119d42;
  sVar6 = strlen((char *)&fStack_12f0);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119d52;
  fVar3 = fdb_iterator_seek((fdb_iterator *)pfVar13,pfVar11,sVar6,'\0');
  if (fVar3 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a4a0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119d6a;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  unaff_R12 = aaStack_1370[0];
  pfVar16 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a4a5;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[0].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119d93;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  if (iVar4 != 0) goto LAB_0011a4aa;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar16 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(unaff_R12.end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119db3;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a4b5;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar16 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(unaff_R12.end_seqnum + 0x40))->
            seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119dd3;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a4c0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119de3;
  fdb_doc_free((fdb_doc *)pfVar16);
  pfVar16 = (fdb_kvs_handle *)auStack_1398._8_8_;
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  pfVar11 = *(fdb_kvs_handle **)(aaStack_1370[2].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119e07;
  sVar6 = strlen((char *)&fStack_12f0);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119e17;
  fVar3 = fdb_iterator_seek((fdb_iterator *)pfVar16,pfVar11,sVar6,'\0');
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a4cb;
  unaff_R13.end_seqnum = 2;
  pfVar16 = (fdb_kvs_handle *)auStack_1398;
  pfVar26 = pfVar11;
  do {
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119e37;
    fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)pfVar16);
    pfVar11 = (fdb_kvs_handle *)auStack_1398._0_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a3ae;
    pfVar23 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                aaStack_1370[unaff_R13.end_seqnum].end_seqnum;
    unaff_R12 = unaff_RBP[4];
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119e5f;
    iVar4 = bcmp(pfVar23,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
    if (iVar4 != 0) goto LAB_0011a3a3;
    pfVar23 = *(fdb_kvs_handle **)((long)pfVar11 + 0x38);
    unaff_R12 = unaff_RBP[7];
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119e7e;
    iVar4 = bcmp(pfVar23,(void *)unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp);
    pfVar13 = pfVar16;
    if (iVar4 != 0) goto LAB_0011a3be;
    pfVar23 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar11 + 0x40))->seqtree;
    unaff_R12 = unaff_RBP[8];
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119e9d;
    iVar4 = bcmp(pfVar23,(void *)unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar4 != 0) goto LAB_0011a3b3;
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119ead;
    fdb_doc_free((fdb_doc *)pfVar11);
    auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
    unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119ec3;
    fVar3 = fdb_iterator_next((fdb_iterator *)auStack_1398._8_8_);
    pfVar13 = (fdb_kvs_handle *)auStack_1398._8_8_;
    pfVar26 = pfVar11;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xa) goto LAB_0011a4d0;
  pfVar11 = *(fdb_kvs_handle **)(aaStack_1370[3].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119ef1;
  sVar6 = strlen((char *)&fStack_12f0);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119f01;
  fVar3 = fdb_iterator_seek((fdb_iterator *)pfVar13,pfVar11,sVar6,'\0');
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a4d5;
  unaff_R13.end_seqnum = 3;
  pfVar13 = (fdb_kvs_handle *)auStack_1398;
  pfVar16 = pfVar11;
  do {
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119f21;
    fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)pfVar13);
    pfVar11 = (fdb_kvs_handle *)auStack_1398._0_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a3d4;
    pfVar23 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                aaStack_1370[unaff_R13.end_seqnum].end_seqnum;
    unaff_R12 = unaff_RBP[4];
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119f49;
    iVar4 = bcmp(pfVar23,(void *)unaff_R12,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
    if (iVar4 != 0) goto LAB_0011a3c9;
    pfVar23 = *(fdb_kvs_handle **)((long)pfVar11 + 0x38);
    unaff_R12 = unaff_RBP[7];
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119f68;
    iVar4 = bcmp(pfVar23,(void *)unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp);
    if (iVar4 != 0) goto LAB_0011a3e4;
    pfVar23 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar11 + 0x40))->seqtree;
    unaff_R12 = unaff_RBP[8];
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119f87;
    iVar4 = bcmp(pfVar23,(void *)unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
    if (iVar4 != 0) goto LAB_0011a3d9;
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119f97;
    fdb_doc_free((fdb_doc *)pfVar11);
    auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
    unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119fad;
    fVar3 = fdb_iterator_next((fdb_iterator *)auStack_1398._8_8_);
    pfVar16 = pfVar11;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xa) goto LAB_0011a4da;
  pfVar13 = (fdb_kvs_handle *)(auStack_1398 + 8);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119fcd;
  fdb_iterator_close((fdb_iterator *)auStack_1398._8_8_);
  pfVar11 = &fStack_12f0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x119fee;
  sprintf((char *)pfVar11,"key%d",4);
  unaff_R12.end_seqnum = (fdb_seqnum_t)&fStack_12f0.bub_ctx.handle;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a008;
  sprintf((char *)unaff_R12,"key%d",8);
  pfVar23 = pfStack_1388;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a015;
  unaff_R13.end_seqnum = strlen((char *)pfVar11);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a020;
  sVar6 = strlen((char *)unaff_R12);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a03e;
  fVar3 = fdb_iterator_init(pfVar23,(fdb_iterator **)pfVar13,pfVar11,unaff_R13.end_keylen,
                            (void *)unaff_R12,sVar6,2);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a4df;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a050;
  fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_1398._8_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a4e4;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a067;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  pfVar16 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a4e9;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[8].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a090;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  unaff_R12 = aaStack_1370[8];
  if (iVar4 != 0) goto LAB_0011a4ee;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar16 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[8].end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a0b0;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a4f9;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar16 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_1370[8].end_seqnum + 0x40))->
            seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a0d0;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a504;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a0e0;
  fdb_doc_free((fdb_doc *)pfVar16);
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a0f3;
  fVar3 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_1398._8_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a50f;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a10a;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  pfVar13 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a514;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[4].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a133;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  unaff_R12 = aaStack_1370[4];
  if (iVar4 != 0) goto LAB_0011a519;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar13 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[4].end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a153;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a524;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_1370[4].end_seqnum + 0x40))->
            seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a173;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a52f;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a183;
  fdb_doc_free((fdb_doc *)pfVar13);
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a196;
  fVar3 = fdb_iterator_close((fdb_iterator *)auStack_1398._8_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a53a;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a1be;
  fVar3 = fdb_iterator_init(pfStack_1388,(fdb_iterator **)(auStack_1398 + 8),(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a53f;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a1d0;
  fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_1398._8_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a544;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a1e7;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  pfVar16 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a549;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[9].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a210;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  unaff_R12 = aaStack_1370[9];
  if (iVar4 != 0) goto LAB_0011a54e;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar16 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[9].end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a230;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a559;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar16 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_1370[9].end_seqnum + 0x40))->
            seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a250;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar16->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a564;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a260;
  fdb_doc_free((fdb_doc *)pfVar16);
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a273;
  fVar3 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_1398._8_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a56f;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a28a;
  fVar3 = fdb_iterator_get((fdb_iterator *)auStack_1398._8_8_,(fdb_doc **)auStack_1398);
  pfVar13 = (fdb_kvs_handle *)auStack_1398._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a574;
  pfVar11 = *(fdb_kvs_handle **)(auStack_1398._0_8_ + 0x20);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[0].end_seqnum + 0x20);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a2b3;
  iVar4 = bcmp(pfVar11,pfVar23,*(size_t *)(fdb_kvs_config *)auStack_1398._0_8_);
  unaff_R12 = aaStack_1370[0];
  if (iVar4 != 0) goto LAB_0011a579;
  pfVar11 = *(fdb_kvs_handle **)((long)pfVar13 + 0x38);
  pfVar23 = *(fdb_kvs_handle **)(aaStack_1370[0].end_seqnum + 0x38);
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a2d3;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp);
  if (iVar4 != 0) goto LAB_0011a584;
  pfVar11 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
  pfVar23 = (fdb_kvs_handle *)
            ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_1370[0].end_seqnum + 0x40))->
            seqtree;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a2f3;
  iVar4 = bcmp(pfVar11,pfVar23,(size_t)(pfVar13->kvs_config).custom_cmp_param);
  if (iVar4 != 0) goto LAB_0011a58f;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a303;
  fdb_doc_free((fdb_doc *)pfVar13);
  auStack_1398._0_8_ = (fdb_kvs_handle *)0x0;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a316;
  fVar3 = fdb_iterator_close((fdb_iterator *)auStack_1398._8_8_);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a328;
    fdb_kvs_close(pfStack_1378);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a332;
    fdb_kvs_close(pfStack_1388);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a33c;
    fdb_close(pfStack_1380);
    lVar22 = 0;
    do {
      paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a348;
      fdb_doc_free((fdb_doc *)aaStack_1370[lVar22]);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 10);
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a356;
    fdb_shutdown();
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a35b;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (iterator_seek_wal_only_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a38c;
    fprintf(_stderr,pcVar21,"iterator seek wal only test");
    return;
  }
  goto LAB_0011a59a;
LAB_00118bb4:
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bb9;
  reverse_sequence_iterator_kvs_test();
LAB_00118bb9:
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bbe;
  reverse_sequence_iterator_kvs_test();
LAB_00118bbe:
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bc3;
  reverse_sequence_iterator_kvs_test();
LAB_00118bc3:
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bce;
  reverse_sequence_iterator_kvs_test();
  aVar25 = aVar5;
LAB_00118bce:
  aVar5 = aVar25;
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bd3;
  reverse_sequence_iterator_kvs_test();
LAB_00118bd3:
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118bde;
  reverse_sequence_iterator_kvs_test();
LAB_00118bde:
  paStack_550 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x118be9;
  reverse_sequence_iterator_kvs_test();
  goto LAB_00118be9;
LAB_001193b0:
  pbStack_a28 = (btree *)0x1193bb;
  reverse_iterator_test();
  pfVar14 = doc_00;
LAB_001193bb:
  doc_00 = pfVar14;
  pbStack_a28 = (btree *)0x1193c0;
  reverse_iterator_test();
LAB_001193c0:
  pbStack_a28 = (btree *)0x1193cb;
  reverse_iterator_test();
LAB_001193cb:
  pbStack_a28 = (btree *)0x1193d6;
  reverse_iterator_test();
LAB_001193d6:
  pbStack_a28 = (btree *)0x1193e1;
  reverse_iterator_test();
  pfVar14 = doc_00;
LAB_001193e1:
  doc_00 = pfVar14;
  pbStack_a28 = (btree *)0x1193e6;
  reverse_iterator_test();
LAB_001193e6:
  pbStack_a28 = (btree *)0x1193f1;
  reverse_iterator_test();
LAB_001193f1:
  pbStack_a28 = (btree *)0x1193fc;
  reverse_iterator_test();
  pfVar14 = doc_00;
LAB_001193fc:
  doc_00 = pfVar14;
  pbStack_a28 = (btree *)0x119401;
  reverse_iterator_test();
LAB_00119401:
  pbStack_a28 = (btree *)0x11940c;
  reverse_iterator_test();
LAB_0011940c:
  pbStack_a28 = (btree *)0x119417;
  reverse_iterator_test();
LAB_00119417:
  pfVar15 = (fdb_doc *)auStack_a10;
  pbStack_a28 = (btree *)0x119422;
  reverse_iterator_test();
  goto LAB_00119422;
LAB_0011a830:
  pcStack_1730 = (code *)0x11a835;
  iterator_after_wal_threshold();
  goto LAB_0011a835;
LAB_0011acdb:
  pfStack_18f8 = (fdb_kvs_handle *)0x11ace0;
  iterator_manual_wal_flush();
LAB_0011ace0:
  ptr_iterator = &pfStack_18e0;
  pfStack_18f8 = (fdb_kvs_handle *)0x11ace5;
  iterator_manual_wal_flush();
  goto LAB_0011ace5;
LAB_0011b2d3:
  pfStack_1dc0 = (fdb_kvs_handle *)0x11b2de;
  sequence_iterator_seek_test();
  pfVar27 = pfVar18;
LAB_0011b2de:
  pfVar18 = pfVar27;
  pfStack_1dc0 = (fdb_kvs_handle *)0x11b2e3;
  sequence_iterator_seek_test();
LAB_0011b2e3:
  pfStack_1dc0 = (fdb_kvs_handle *)0x11b2ee;
  sequence_iterator_seek_test();
LAB_0011b2ee:
  pfStack_1dc0 = (fdb_kvs_handle *)0x11b2f9;
  sequence_iterator_seek_test();
LAB_0011b2f9:
  pfStack_1dc0 = (fdb_kvs_handle *)0x11b304;
  sequence_iterator_seek_test();
  pfVar27 = pfVar18;
  goto LAB_0011b304;
LAB_0011b623:
  ppfVar17 = &pfStack_2158;
  ppfStack_2168 = (fdb_doc **)0x11b628;
  iterator_concurrent_compaction();
  goto LAB_0011b628;
LAB_0011bb51:
  ppfStack_4440 = (fdb_doc **)0x11bb56;
  iterator_offset_access_test();
LAB_0011bb56:
  ppfStack_4440 = (fdb_doc **)0x11bb5b;
  iterator_offset_access_test();
LAB_0011bb5b:
  ppfStack_4440 = (fdb_doc **)0x11bb60;
  iterator_offset_access_test();
LAB_0011bb60:
  ppfStack_4440 = (fdb_doc **)0x11bb65;
  iterator_offset_access_test();
LAB_0011bb65:
  ppfStack_4440 = (fdb_doc **)0x11bb6a;
  iterator_offset_access_test();
LAB_0011bb6a:
  ppfStack_4440 = (fdb_doc **)0x11bb6f;
  iterator_offset_access_test();
LAB_0011bb6f:
  ppfStack_4440 = (fdb_doc **)0x11bb74;
  iterator_offset_access_test();
  goto LAB_0011bb74;
LAB_0011a3a3:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3ae;
  iterator_seek_wal_only_test();
  pfVar26 = pfVar11;
LAB_0011a3ae:
  pfVar11 = pfVar26;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3b3;
  iterator_seek_wal_only_test();
  pfVar13 = pfVar16;
LAB_0011a3b3:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3be;
  iterator_seek_wal_only_test();
LAB_0011a3be:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3c9;
  iterator_seek_wal_only_test();
LAB_0011a3c9:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3d4;
  iterator_seek_wal_only_test();
  pfVar16 = pfVar11;
LAB_0011a3d4:
  pfVar11 = pfVar16;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3d9;
  iterator_seek_wal_only_test();
LAB_0011a3d9:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3e4;
  iterator_seek_wal_only_test();
LAB_0011a3e4:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3ef;
  iterator_seek_wal_only_test();
LAB_0011a3ef:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3f4;
  iterator_seek_wal_only_test();
LAB_0011a3f4:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3f9;
  iterator_seek_wal_only_test();
LAB_0011a3f9:
  aVar5 = unaff_R12;
  pfVar16 = pfVar13;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a3fe;
  iterator_seek_wal_only_test();
LAB_0011a3fe:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a409;
  iterator_seek_wal_only_test();
LAB_0011a409:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a414;
  iterator_seek_wal_only_test();
LAB_0011a414:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a41f;
  iterator_seek_wal_only_test();
LAB_0011a41f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a424;
  iterator_seek_wal_only_test();
LAB_0011a424:
  aVar9 = aVar5;
  pfVar13 = pfVar16;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a429;
  iterator_seek_wal_only_test();
LAB_0011a429:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a434;
  iterator_seek_wal_only_test();
LAB_0011a434:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a43f;
  iterator_seek_wal_only_test();
LAB_0011a43f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a44a;
  iterator_seek_wal_only_test();
LAB_0011a44a:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a44f;
  iterator_seek_wal_only_test();
LAB_0011a44f:
  aVar5 = aVar9;
  pfVar16 = pfVar13;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a454;
  iterator_seek_wal_only_test();
LAB_0011a454:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a45f;
  iterator_seek_wal_only_test();
LAB_0011a45f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a46a;
  iterator_seek_wal_only_test();
LAB_0011a46a:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a475;
  iterator_seek_wal_only_test();
LAB_0011a475:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a47a;
  iterator_seek_wal_only_test();
LAB_0011a47a:
  aVar9 = aVar5;
  pfVar13 = pfVar16;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a47f;
  iterator_seek_wal_only_test();
LAB_0011a47f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a48a;
  iterator_seek_wal_only_test();
LAB_0011a48a:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a495;
  iterator_seek_wal_only_test();
LAB_0011a495:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4a0;
  iterator_seek_wal_only_test();
LAB_0011a4a0:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4a5;
  iterator_seek_wal_only_test();
LAB_0011a4a5:
  unaff_R12 = aVar9;
  pfVar16 = pfVar13;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4aa;
  iterator_seek_wal_only_test();
LAB_0011a4aa:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4b5;
  iterator_seek_wal_only_test();
LAB_0011a4b5:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4c0;
  iterator_seek_wal_only_test();
LAB_0011a4c0:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4cb;
  iterator_seek_wal_only_test();
LAB_0011a4cb:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4d0;
  iterator_seek_wal_only_test();
LAB_0011a4d0:
  pfVar13 = pfVar16;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4d5;
  iterator_seek_wal_only_test();
LAB_0011a4d5:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4da;
  iterator_seek_wal_only_test();
LAB_0011a4da:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4df;
  iterator_seek_wal_only_test();
LAB_0011a4df:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4e4;
  iterator_seek_wal_only_test();
LAB_0011a4e4:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4e9;
  iterator_seek_wal_only_test();
LAB_0011a4e9:
  pfVar16 = pfVar13;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4ee;
  iterator_seek_wal_only_test();
LAB_0011a4ee:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a4f9;
  iterator_seek_wal_only_test();
LAB_0011a4f9:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a504;
  iterator_seek_wal_only_test();
LAB_0011a504:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a50f;
  iterator_seek_wal_only_test();
LAB_0011a50f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a514;
  iterator_seek_wal_only_test();
LAB_0011a514:
  pfVar13 = pfVar16;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a519;
  iterator_seek_wal_only_test();
LAB_0011a519:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a524;
  iterator_seek_wal_only_test();
LAB_0011a524:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a52f;
  iterator_seek_wal_only_test();
LAB_0011a52f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a53a;
  iterator_seek_wal_only_test();
LAB_0011a53a:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a53f;
  iterator_seek_wal_only_test();
LAB_0011a53f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a544;
  iterator_seek_wal_only_test();
LAB_0011a544:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a549;
  iterator_seek_wal_only_test();
LAB_0011a549:
  pfVar16 = pfVar13;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a54e;
  iterator_seek_wal_only_test();
LAB_0011a54e:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a559;
  iterator_seek_wal_only_test();
LAB_0011a559:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a564;
  iterator_seek_wal_only_test();
LAB_0011a564:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a56f;
  iterator_seek_wal_only_test();
LAB_0011a56f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a574;
  iterator_seek_wal_only_test();
LAB_0011a574:
  pfVar13 = pfVar16;
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a579;
  iterator_seek_wal_only_test();
LAB_0011a579:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a584;
  iterator_seek_wal_only_test();
LAB_0011a584:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a58f;
  iterator_seek_wal_only_test();
LAB_0011a58f:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x11a59a;
  iterator_seek_wal_only_test();
LAB_0011a59a:
  paStack_13a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)iterator_after_wal_threshold;
  iterator_seek_wal_only_test();
  pcStack_1730 = (code *)0x11a5bc;
  pfStack_13d0 = pfVar13;
  aStack_13c8 = unaff_R12;
  aStack_13c0 = unaff_R13;
  pfStack_13b8 = pfVar11;
  pfStack_13b0 = pfVar23;
  paStack_13a8 = unaff_RBP;
  gettimeofday(&tStack_16f8,(__timezone_ptr_t)0x0);
  pcStack_1730 = (code *)0x11a5c1;
  memleak_start();
  pfStack_1720 = (fdb_iterator *)0x0;
  pcStack_1730 = (code *)0x11a5d7;
  fdb_get_default_config();
  pcStack_1730 = (code *)0x11a5e4;
  fdb_get_default_kvs_config();
  fStack_16d0.wal_threshold = 10;
  fStack_16d0.flags = 1;
  fStack_16d0.seqtree_opt = '\x01';
  pcStack_1730 = (code *)0x11a605;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_1730 = (code *)0x11a61c;
  fdb_open(&pfStack_1700,"./iterator_test1",&fStack_16d0);
  pcStack_1730 = (code *)0x11a633;
  fdb_kvs_open(pfStack_1700,&pfStack_1710,"db1",&fStack_16e8);
  pcStack_1730 = (code *)0x11a64a;
  fdb_kvs_open(pfStack_1700,&pfStack_1708,"db2",&fStack_16e8);
  uVar28 = 0;
  do {
    pcStack_1730 = (code *)0x11a676;
    sprintf(acStack_14d8,"key%d",uVar28);
    pcStack_1730 = (code *)0x11a685;
    sprintf(acStack_15d8,"body%d",uVar28);
    pfVar23 = pfStack_1710;
    pcStack_1730 = (code *)0x11a692;
    ppfVar12 = (fdb_iterator **)strlen(acStack_14d8);
    pcStack_1730 = (code *)0x11a69d;
    sVar6 = strlen(acStack_15d8);
    pcStack_1730 = (code *)0x11a6b1;
    fdb_set_kv(pfVar23,acStack_14d8,(size_t)ppfVar12,acStack_15d8,sVar6);
    uVar19 = (int)uVar28 + 1;
    uVar28 = (ulong)uVar19;
  } while (uVar19 != 6);
  pcStack_1730 = (code *)0x11a6ce;
  fVar3 = fdb_iterator_sequence_init(pfStack_1710,&pfStack_1718,0,0,0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    do {
      pcStack_1730 = (code *)0x11a6e8;
      fVar3 = fdb_iterator_get(pfStack_1718,(fdb_doc **)&pfStack_1720);
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011a82b:
        pcStack_1730 = (code *)0x11a830;
        iterator_after_wal_threshold();
        goto LAB_0011a830;
      }
      pcStack_1730 = (code *)0x11a70b;
      fVar3 = fdb_set_kv(pfStack_1708,(void *)pfStack_1720->_seqnum,(size_t)pfStack_1720->handle,
                         (void *)0x0,0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcStack_1730 = (code *)0x11a82b;
        iterator_after_wal_threshold();
        goto LAB_0011a82b;
      }
      pcStack_1730 = (code *)0x11a71d;
      fdb_doc_free((fdb_doc *)pfStack_1720);
      pfStack_1720 = (fdb_iterator *)0x0;
      pcStack_1730 = (code *)0x11a730;
      fVar3 = fdb_iterator_next(pfStack_1718);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ppfVar12 = &pfStack_1718;
    pcStack_1730 = (code *)0x11a742;
    fdb_iterator_close(pfStack_1718);
    pcStack_1730 = (code *)0x11a756;
    fVar3 = fdb_iterator_sequence_init(pfStack_1710,ppfVar12,0,0,0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      while( true ) {
        pcStack_1730 = (code *)0x11a770;
        fVar3 = fdb_iterator_get(pfStack_1718,(fdb_doc **)&pfStack_1720);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pcStack_1730 = (code *)0x11a787;
        fVar3 = fdb_get(pfStack_1710,(fdb_doc *)pfStack_1720);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011a830;
        pcStack_1730 = (code *)0x11a799;
        fdb_doc_free((fdb_doc *)pfStack_1720);
        pfStack_1720 = (fdb_iterator *)0x0;
        pcStack_1730 = (code *)0x11a7ac;
        fVar3 = fdb_iterator_next(pfStack_1718);
        if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_1730 = (code *)0x11a7bb;
          fdb_iterator_close(pfStack_1718);
          pcStack_1730 = (code *)0x11a7c5;
          fdb_kvs_close(pfStack_1710);
          pcStack_1730 = (code *)0x11a7cf;
          fdb_kvs_close(pfStack_1708);
          pcStack_1730 = (code *)0x11a7d9;
          fdb_close(pfStack_1700);
          pcStack_1730 = (code *)0x11a7de;
          fdb_shutdown();
          pcStack_1730 = (code *)0x11a7e3;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (iterator_after_wal_threshold()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pcStack_1730 = (code *)0x11a814;
          fprintf(_stderr,pcVar21,"iterator after wal threshold");
          return;
        }
      }
LAB_0011a835:
      ppfVar12 = &pfStack_1720;
      pcStack_1730 = (code *)0x11a83a;
      iterator_after_wal_threshold();
      goto LAB_0011a83a;
    }
  }
  else {
LAB_0011a83a:
    pcStack_1730 = (code *)0x11a83f;
    iterator_after_wal_threshold();
  }
  pcStack_1730 = iterator_manual_wal_flush;
  iterator_after_wal_threshold();
  pcStack_1738 = "body%d";
  pfStack_1748 = pfVar23;
  pfStack_18f8 = (fdb_kvs_handle *)0x11a861;
  ppfStack_1758 = ppfVar12;
  pcStack_1750 = acStack_15d8;
  pcStack_1740 = acStack_14d8;
  pcStack_1730 = (code *)uVar28;
  gettimeofday(&tStack_1878,(__timezone_ptr_t)0x0);
  pfStack_18f8 = (fdb_kvs_handle *)0x11a866;
  memleak_start();
  uStack_1898 = 0x3106002d;
  uStack_18a0 = 0x3032343e3e0508;
  uStack_1899 = 0x31;
  uStack_1890._0_2_ = 0x508;
  uStack_1890._2_6_ = 0x313032343e3e;
  pvStack_1888 = (void *)0x323106002d31;
  uStack_1880 = 0;
  ptr_iterator = (fdb_kvs_handle **)auStack_18b0;
  auStack_18b0._0_7_ = 0x3931343e3e0508;
  auStack_18b0._7_4_ = 0x2d3939;
  uStack_18d0 = 0x3433343e3e0508;
  uStack_18c9 = 0x140a35;
  pfStack_18e0 = (fdb_kvs_handle *)0x0;
  pfStack_18f8 = (fdb_kvs_handle *)0x11a8e4;
  fdb_get_default_config();
  pfVar23 = (fdb_kvs_handle *)auStack_1868;
  pfStack_18f8 = (fdb_kvs_handle *)0x11a8f4;
  fdb_get_default_kvs_config();
  pfStack_1840 = (fdb_file_handle *)0x400;
  uStack_182c = 1;
  pfStack_18f8 = (fdb_kvs_handle *)0x11a910;
  system("rm -rf  iterator_test* > errorlog.txt");
  pbVar10 = (btree *)&pfStack_18b8;
  pfStack_18f8 = (fdb_kvs_handle *)0x11a927;
  fdb_open((fdb_file_handle **)pbVar10,"./iterator_test1",(fdb_config *)(auStack_1868 + 0x18));
  ppfVar17 = &pfStack_18c0;
  pfStack_18f8 = (fdb_kvs_handle *)0x11a942;
  fdb_kvs_open(pfStack_18b8,ppfVar17,"db1",(fdb_kvs_config *)pfVar23);
  pfStack_18f8 = (fdb_kvs_handle *)0x11a95a;
  fdb_kvs_open(pfStack_18b8,&pfStack_18d8,"db2",(fdb_kvs_config *)pfVar23);
  pfStack_18f8 = (fdb_kvs_handle *)0x11a970;
  fdb_set_kv(pfStack_18c0,&uStack_18a0,0xf,(void *)0x0,0);
  pfStack_18f8 = (fdb_kvs_handle *)0x11a986;
  fdb_set_kv(pfStack_18c0,&uStack_1890,0x11,(void *)0x0,0);
  pfStack_18f8 = (fdb_kvs_handle *)0x11a991;
  fdb_commit(pfStack_18b8,'\0');
  pfStack_18f8 = (fdb_kvs_handle *)0x11a9b4;
  pfVar13 = pfStack_18c0;
  fVar3 = fdb_iterator_init(pfStack_18c0,(fdb_iterator **)&pfStack_18e8,ptr_iterator,0xb,(void *)0x0
                            ,0,0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    do {
      pfStack_18f8 = (fdb_kvs_handle *)0x11a9ce;
      pfVar13 = pfStack_18e8;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_18e8,(fdb_doc **)&pfStack_18e0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_18f8 = (fdb_kvs_handle *)0x11acdb;
        iterator_manual_wal_flush();
        goto LAB_0011acdb;
      }
      pfStack_18f8 = (fdb_kvs_handle *)0x11a9e0;
      fdb_doc_free((fdb_doc *)pfStack_18e0);
      pfStack_18e0 = (fdb_kvs_handle *)0x0;
      pfStack_18f8 = (fdb_kvs_handle *)0x11a9f3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_18e8);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_18e8;
    pfStack_18f8 = (fdb_kvs_handle *)0x11aa05;
    fdb_iterator_close((fdb_iterator *)pfStack_18e8);
    pfStack_18f8 = (fdb_kvs_handle *)0x11aa29;
    pfVar13 = pfStack_18c0;
    fVar3 = fdb_iterator_init(pfStack_18c0,(fdb_iterator **)ptr_iterator,&uStack_18d0,0xb,
                              (void *)0x0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acea;
    pfStack_18f8 = (fdb_kvs_handle *)0x11aa40;
    pfVar13 = pfStack_18e8;
    fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_18e8,(fdb_doc **)&pfStack_18e0);
    if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011acef;
    ptr_iterator = &pfStack_18e8;
    pfStack_18f8 = (fdb_kvs_handle *)0x11aa55;
    fdb_iterator_close((fdb_iterator *)pfStack_18e8);
    pfStack_18f8 = (fdb_kvs_handle *)0x11aa6e;
    fdb_set_kv(pfStack_18d8,&uStack_18a0,0xf,(void *)0x0,0);
    pfStack_18f8 = (fdb_kvs_handle *)0x11aa87;
    fdb_set_kv(pfStack_18d8,&uStack_1890,0x11,(void *)0x0,0);
    pfStack_18f8 = (fdb_kvs_handle *)0x11aa96;
    fdb_commit(pfStack_18b8,'\x01');
    pfStack_18f8 = (fdb_kvs_handle *)0x11aaba;
    pfVar13 = pfStack_18d8;
    fVar3 = fdb_iterator_init(pfStack_18d8,(fdb_iterator **)ptr_iterator,auStack_18b0,0xb,
                              (void *)0x0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acf4;
    do {
      pfStack_18f8 = (fdb_kvs_handle *)0x11aad4;
      pfVar13 = pfStack_18e8;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_18e8,(fdb_doc **)&pfStack_18e0);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acdb;
      pfStack_18f8 = (fdb_kvs_handle *)0x11aae6;
      fdb_doc_free((fdb_doc *)pfStack_18e0);
      pfStack_18e0 = (fdb_kvs_handle *)0x0;
      pfStack_18f8 = (fdb_kvs_handle *)0x11aaf9;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_18e8);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_18e8;
    pfStack_18f8 = (fdb_kvs_handle *)0x11ab0b;
    fdb_iterator_close((fdb_iterator *)pfStack_18e8);
    pfStack_18f8 = (fdb_kvs_handle *)0x11ab2f;
    pfVar13 = pfStack_18c0;
    fVar3 = fdb_iterator_init(pfStack_18c0,(fdb_iterator **)ptr_iterator,&uStack_18d0,0xb,
                              (void *)0x0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011acf9;
    pfStack_18f8 = (fdb_kvs_handle *)0x11ab46;
    pfVar13 = pfStack_18e8;
    fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_18e8,(fdb_doc **)&pfStack_18e0);
    if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011acfe;
    ptr_iterator = &pfStack_18e8;
    pfStack_18f8 = (fdb_kvs_handle *)0x11ab5b;
    fdb_iterator_close((fdb_iterator *)pfStack_18e8);
    pfStack_18f8 = (fdb_kvs_handle *)0x11ab7e;
    fVar3 = fdb_iterator_init(pfStack_18d8,(fdb_iterator **)ptr_iterator,(void *)0x0,0,auStack_18b0,
                              0xb,0);
    pfVar13 = pfStack_18d8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ad03;
    pfStack_18f8 = (fdb_kvs_handle *)0x11ab9f;
    pfVar13 = pfStack_18e8;
    fVar3 = fdb_iterator_seek((fdb_iterator *)pfStack_18e8,auStack_18b0,0xb,'\x01');
    if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011ad08;
    ptr_iterator = &pfStack_18e8;
    pfStack_18f8 = (fdb_kvs_handle *)0x11abb4;
    fdb_iterator_close((fdb_iterator *)pfStack_18e8);
    pfStack_18f8 = (fdb_kvs_handle *)0x11abd7;
    fVar3 = fdb_iterator_init(pfStack_18c0,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&uStack_18d0,
                              0xb,0);
    pfVar13 = pfStack_18c0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ad0d;
    pfStack_18f8 = (fdb_kvs_handle *)0x11abf8;
    pfVar13 = pfStack_18e8;
    fVar3 = fdb_iterator_seek((fdb_iterator *)pfStack_18e8,&uStack_18d0,0xb,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ad12;
    pfStack_18f8 = (fdb_kvs_handle *)0x11ac0f;
    pfVar13 = pfStack_18e8;
    fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_18e8,(fdb_doc **)&pfStack_18e0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_18f8 = (fdb_kvs_handle *)0x11ac21;
      fdb_doc_free((fdb_doc *)pfStack_18e0);
      pfStack_18e0 = (fdb_kvs_handle *)0x0;
      pfStack_18f8 = (fdb_kvs_handle *)0x11ac34;
      fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_18e8);
      if (fVar3 != FDB_RESULT_ITERATOR_FAIL) {
        do {
          pfStack_18f8 = (fdb_kvs_handle *)0x11ac4b;
          pfVar13 = pfStack_18e8;
          fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_18e8,(fdb_doc **)&pfStack_18e0);
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011ace0;
          pfStack_18f8 = (fdb_kvs_handle *)0x11ac5d;
          fdb_doc_free((fdb_doc *)pfStack_18e0);
          pfStack_18e0 = (fdb_kvs_handle *)0x0;
          pfStack_18f8 = (fdb_kvs_handle *)0x11ac70;
          fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_18e8);
        } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
      }
      pfStack_18f8 = (fdb_kvs_handle *)0x11ac7f;
      fdb_iterator_close((fdb_iterator *)pfStack_18e8);
      pfStack_18f8 = (fdb_kvs_handle *)0x11ac89;
      fdb_close(pfStack_18b8);
      pfStack_18f8 = (fdb_kvs_handle *)0x11ac8e;
      fdb_shutdown();
      pfStack_18f8 = (fdb_kvs_handle *)0x11ac93;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_manual_wal_flush()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_18f8 = (fdb_kvs_handle *)0x11acc4;
      fprintf(_stderr,pcVar21,"iterator manual wal flush");
      return;
    }
  }
  else {
LAB_0011ace5:
    pfStack_18f8 = (fdb_kvs_handle *)0x11acea;
    iterator_manual_wal_flush();
LAB_0011acea:
    pfStack_18f8 = (fdb_kvs_handle *)0x11acef;
    iterator_manual_wal_flush();
LAB_0011acef:
    pfStack_18f8 = (fdb_kvs_handle *)0x11acf4;
    iterator_manual_wal_flush();
LAB_0011acf4:
    pfStack_18f8 = (fdb_kvs_handle *)0x11acf9;
    iterator_manual_wal_flush();
LAB_0011acf9:
    pfStack_18f8 = (fdb_kvs_handle *)0x11acfe;
    iterator_manual_wal_flush();
LAB_0011acfe:
    pfStack_18f8 = (fdb_kvs_handle *)0x11ad03;
    iterator_manual_wal_flush();
LAB_0011ad03:
    pfStack_18f8 = (fdb_kvs_handle *)0x11ad08;
    iterator_manual_wal_flush();
LAB_0011ad08:
    pfStack_18f8 = (fdb_kvs_handle *)0x11ad0d;
    iterator_manual_wal_flush();
LAB_0011ad0d:
    pfStack_18f8 = (fdb_kvs_handle *)0x11ad12;
    iterator_manual_wal_flush();
LAB_0011ad12:
    pfStack_18f8 = (fdb_kvs_handle *)0x11ad17;
    iterator_manual_wal_flush();
  }
  pfStack_18f8 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar13 & 0xffffffff);
  pfStack_1dc0 = (fdb_kvs_handle *)0x11ad41;
  ppfStack_1920 = ptr_iterator;
  pbStack_1918 = pbVar10;
  ppfStack_1910 = ppfVar17;
  puStack_1908 = &uStack_1890;
  puStack_1900 = &uStack_18a0;
  pfStack_18f8 = pfVar23;
  gettimeofday(&tStack_1d28,(__timezone_ptr_t)0x0);
  pfStack_1dc0 = (fdb_kvs_handle *)0x11ad46;
  memleak_start();
  pfStack_1da8 = (fdb_config *)0x0;
  pfStack_1dc0 = (fdb_kvs_handle *)0x11ad57;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar18 = &fStack_1a18;
  pfStack_1dc0 = (fdb_kvs_handle *)0x11ad67;
  fdb_get_default_config();
  pfStack_1dc0 = (fdb_kvs_handle *)0x11ad71;
  fdb_get_default_kvs_config();
  fStack_1a18.buffercache_size = 0;
  fStack_1a18.wal_threshold = 0x400;
  fStack_1a18.seqtree_opt = '\x01';
  fStack_1a18.flags = 1;
  fStack_1a18.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_1a18.compaction_threshold = '\0';
  ptr_fhandle = &pfStack_1d98;
  pfStack_1dc0 = (fdb_kvs_handle *)0x11adaa;
  fdb_open(ptr_fhandle,"./iterator_test7",pfVar18);
  if ((int)pfVar13 == 0) {
    pfStack_1dc0 = (fdb_kvs_handle *)0x11add8;
    fdb_kvs_open_default(pfStack_1d98,&pfStack_1da0,&fStack_1d90);
  }
  else {
    pfStack_1dc0 = (fdb_kvs_handle *)0x11adc7;
    fdb_kvs_open(pfStack_1d98,&pfStack_1da0,"kv1",&fStack_1d90);
  }
  pfStack_1dc0 = (fdb_kvs_handle *)0x11adf0;
  fVar3 = fdb_set_log_callback(pfStack_1da0,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar22 = 0;
    uVar28 = 0;
    do {
      pfVar1 = &fStack_1d18.config.encryption_key;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11ae18;
      sprintf((char *)pfVar1,"key%d",uVar28 & 0xffffffff);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11ae30;
      sprintf((char *)&fStack_1d18.bub_ctx.handle,"meta%d",uVar28 & 0xffffffff);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11ae48;
      sprintf((char *)&fStack_1d18,"body%d",uVar28 & 0xffffffff);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11ae58;
      sVar6 = strlen((char *)pfVar1);
      ppfVar17 = &fStack_1d18.bub_ctx.handle;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11ae6b;
      sVar7 = strlen((char *)ppfVar17);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11ae7b;
      sVar8 = strlen((char *)&fStack_1d18);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11aea0;
      fdb_doc_create((fdb_doc **)((long)apfStack_1d78 + lVar22),&fStack_1d18.config.encryption_key,
                     sVar6,ppfVar17,sVar7,&fStack_1d18,sVar8);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11aeaf;
      fdb_set(pfStack_1da0,apfStack_1d78[uVar28]);
      uVar28 = uVar28 + 1;
      lVar22 = lVar22 + 8;
    } while (uVar28 != 5);
    pfStack_1dc0 = (fdb_kvs_handle *)0x11aecf;
    fdb_commit(pfStack_1d98,'\x01');
    uVar28 = 5;
    pfVar18 = (fdb_config *)apfStack_1d50;
    do {
      pfVar1 = &fStack_1d18.config.encryption_key;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11aef4;
      sprintf((char *)pfVar1,"key%d",uVar28 & 0xffffffff);
      ppfVar17 = &fStack_1d18.bub_ctx.handle;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11af0f;
      sprintf((char *)ppfVar17,"meta%d",uVar28 & 0xffffffff);
      pfVar23 = &fStack_1d18;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11af2a;
      sprintf((char *)pfVar23,"body%d",uVar28 & 0xffffffff);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11af32;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11af3d;
      pbVar10 = (btree *)strlen((char *)ppfVar17);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11af48;
      sVar6 = strlen((char *)pfVar23);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11af68;
      fdb_doc_create((fdb_doc **)pfVar18,&fStack_1d18.config.encryption_key,(size_t)ptr_fhandle,
                     ppfVar17,(size_t)pbVar10,pfVar23,sVar6);
      pfStack_1dc0 = (fdb_kvs_handle *)0x11af75;
      fdb_set(pfStack_1da0,(fdb_doc *)*(fdb_kvs_handle **)pfVar18);
      uVar28 = uVar28 + 1;
      pfVar18 = (fdb_config *)((long)pfVar18 + 8);
    } while (uVar28 != 10);
    pfStack_1dc0 = (fdb_kvs_handle *)0x11af92;
    fdb_commit(pfStack_1d98,'\0');
    ptr_iterator_00 = &pfStack_1db0;
    pfStack_1dc0 = (fdb_kvs_handle *)0x11afab;
    fdb_iterator_sequence_init(pfStack_1da0,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_1dc0 = (fdb_kvs_handle *)0x11afb3;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_1db0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b324;
    ppfVar17 = apfStack_1d50 + 4;
    pfVar27 = pfVar18;
    do {
      pfStack_1dc0 = (fdb_kvs_handle *)0x11afd5;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1db0,(fdb_doc **)&pfStack_1da8);
      pfVar18 = pfStack_1da8;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011b2b8:
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b2bd;
        sequence_iterator_seek_test();
        pfVar18 = pfVar27;
LAB_0011b2bd:
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b2c8;
        sequence_iterator_seek_test();
LAB_0011b2c8:
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b2d3;
        sequence_iterator_seek_test();
        goto LAB_0011b2d3;
      }
      sVar6._0_2_ = pfStack_1da8->chunksize;
      sVar6._2_2_ = *(undefined2 *)&pfStack_1da8->field_0x2;
      sVar6._4_4_ = pfStack_1da8->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_1da8->seqtree_opt;
      pfVar23 = *ppfVar17;
      pbVar10 = (btree *)pfVar23->op_stats;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11affc;
      iVar4 = bcmp(ptr_fhandle,pbVar10,sVar6);
      pfVar27 = pfVar18;
      if (iVar4 != 0) {
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b2b8;
        sequence_iterator_seek_test();
        goto LAB_0011b2b8;
      }
      ptr_fhandle = (fdb_file_handle **)pfVar18->compactor_sleep_duration;
      pbVar10 = pfVar23->staletree;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b01b;
      iVar4 = bcmp(ptr_fhandle,pbVar10,pfVar18->buffercache_size);
      if (iVar4 != 0) goto LAB_0011b2c8;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar18->multi_kv_instances;
      pbVar10 = (pfVar23->field_6).seqtree;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b03a;
      iVar4 = bcmp(ptr_fhandle,pbVar10,pfVar18->wal_threshold);
      if (iVar4 != 0) goto LAB_0011b2bd;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b04a;
      fdb_doc_free((fdb_doc *)pfVar18);
      pfStack_1da8 = (fdb_config *)0x0;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b05d;
      fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_1db0);
      ppfVar17 = ppfVar17 + -1;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_1db0;
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b077;
    fdb_iterator_close((fdb_iterator *)pfStack_1db0);
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b08e;
    fdb_iterator_sequence_init(pfStack_1da0,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b096;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_1db0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b329;
    ppfVar17 = apfStack_1d50 + 1;
    do {
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b0b5;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1db0,(fdb_doc **)&pfStack_1da8);
      pfVar18 = pfStack_1da8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b2de;
      sVar7._0_2_ = pfStack_1da8->chunksize;
      sVar7._2_2_ = *(undefined2 *)&pfStack_1da8->field_0x2;
      sVar7._4_4_ = pfStack_1da8->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_1da8->seqtree_opt;
      pfVar23 = *ppfVar17;
      pbVar10 = (btree *)pfVar23->op_stats;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b0dc;
      iVar4 = bcmp(ptr_fhandle,pbVar10,sVar7);
      if (iVar4 != 0) goto LAB_0011b2d3;
      ptr_fhandle = (fdb_file_handle **)pfVar18->compactor_sleep_duration;
      pbVar10 = pfVar23->staletree;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b0fb;
      iVar4 = bcmp(ptr_fhandle,pbVar10,pfVar18->buffercache_size);
      if (iVar4 != 0) goto LAB_0011b2ee;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar18->multi_kv_instances;
      pbVar10 = (pfVar23->field_6).seqtree;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b11a;
      iVar4 = bcmp(ptr_fhandle,pbVar10,pfVar18->wal_threshold);
      if (iVar4 != 0) goto LAB_0011b2e3;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b12a;
      fdb_doc_free((fdb_doc *)pfVar18);
      pfStack_1da8 = (fdb_config *)0x0;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b13d;
      fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_1db0);
      ppfVar17 = ppfVar17 + -1;
      pfVar27 = pfVar18;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_1db0;
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b157;
    fdb_iterator_close((fdb_iterator *)pfStack_1db0);
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b171;
    fdb_iterator_sequence_init(pfStack_1da0,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b179;
    fVar3 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_1db0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ppfVar17 = apfStack_1d50;
      while( true ) {
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b198;
        fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1db0,(fdb_doc **)&pfStack_1da8);
        pfVar18 = pfStack_1da8;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sVar8._0_2_ = pfStack_1da8->chunksize;
        sVar8._2_2_ = *(undefined2 *)&pfStack_1da8->field_0x2;
        sVar8._4_4_ = pfStack_1da8->blocksize;
        ptr_fhandle = *(fdb_file_handle ***)&pfStack_1da8->seqtree_opt;
        pfVar23 = *ppfVar17;
        pbVar10 = (btree *)pfVar23->op_stats;
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b1bf;
        iVar4 = bcmp(ptr_fhandle,pbVar10,sVar8);
        if (iVar4 != 0) goto LAB_0011b2f9;
        ptr_fhandle = (fdb_file_handle **)pfVar18->compactor_sleep_duration;
        pbVar10 = pfVar23->staletree;
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b1de;
        iVar4 = bcmp(ptr_fhandle,pbVar10,pfVar18->buffercache_size);
        if (iVar4 != 0) goto LAB_0011b314;
        ptr_fhandle = *(fdb_file_handle ***)&pfVar18->multi_kv_instances;
        pbVar10 = (pfVar23->field_6).seqtree;
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b1fd;
        iVar4 = bcmp(ptr_fhandle,pbVar10,pfVar18->wal_threshold);
        if (iVar4 != 0) goto LAB_0011b309;
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b20d;
        fdb_doc_free((fdb_doc *)pfVar18);
        pfStack_1da8 = (fdb_config *)0x0;
        pfStack_1dc0 = (fdb_kvs_handle *)0x11b220;
        fVar3 = fdb_iterator_prev((fdb_iterator *)pfStack_1db0);
        ppfVar17 = ppfVar17 + -1;
        pfVar27 = pfVar18;
        if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_1dc0 = (fdb_kvs_handle *)0x11b237;
          fdb_iterator_close((fdb_iterator *)pfStack_1db0);
          pfStack_1dc0 = (fdb_kvs_handle *)0x11b241;
          fdb_kvs_close(pfStack_1da0);
          pfStack_1dc0 = (fdb_kvs_handle *)0x11b24b;
          fdb_close(pfStack_1d98);
          lVar22 = 0;
          do {
            pfStack_1dc0 = (fdb_kvs_handle *)0x11b257;
            fdb_doc_free(apfStack_1d78[lVar22]);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 10);
          pfStack_1dc0 = (fdb_kvs_handle *)0x11b265;
          fdb_shutdown();
          pfStack_1dc0 = (fdb_kvs_handle *)0x11b26a;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_1dc0 = (fdb_kvs_handle *)0x11b29b;
          fprintf(_stderr,pcVar21,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b304:
      pfVar18 = pfVar27;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b309;
      sequence_iterator_seek_test();
LAB_0011b309:
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b314;
      sequence_iterator_seek_test();
LAB_0011b314:
      ptr_iterator_00 = &pfStack_1da8;
      pfStack_1dc0 = (fdb_kvs_handle *)0x11b31f;
      sequence_iterator_seek_test();
      goto LAB_0011b31f;
    }
  }
  else {
LAB_0011b31f:
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b324;
    sequence_iterator_seek_test();
LAB_0011b324:
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b329;
    sequence_iterator_seek_test();
LAB_0011b329:
    pfStack_1dc0 = (fdb_kvs_handle *)0x11b32e;
    sequence_iterator_seek_test();
  }
  pfStack_1dc0 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_2168 = (fdb_doc **)0x11b350;
  ppfStack_1de8 = ptr_iterator_00;
  pbStack_1de0 = pbVar10;
  ppfStack_1dd8 = ppfVar17;
  pfStack_1dd0 = pfVar18;
  ppfStack_1dc8 = ptr_fhandle;
  pfStack_1dc0 = pfVar23;
  gettimeofday((timeval *)(auStack_2120 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_2168 = (fdb_doc **)0x11b355;
  memleak_start();
  pfStack_2158 = (fdb_kvs_handle *)0x0;
  ppfStack_2168 = (fdb_doc **)0x11b36b;
  fdb_get_default_config();
  ppfStack_2168 = (fdb_doc **)0x11b378;
  fdb_get_default_kvs_config();
  fStack_20e8.wal_threshold = 0x400;
  fStack_20e8.seqtree_opt = '\x01';
  fStack_20e8.flags = 1;
  ppfStack_2168 = (fdb_doc **)0x11b397;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_2168 = (fdb_doc **)0x11b3ae;
  fdb_open(&pfStack_2138,"./iterator_test1",&fStack_20e8);
  ppfStack_2168 = (fdb_doc **)0x11b3c5;
  fdb_kvs_open(pfStack_2138,&pfStack_2140,"db",(fdb_kvs_config *)(auStack_2120 + 0x10));
  pcVar21 = "body%d";
  pfVar23 = (fdb_kvs_handle *)(apfStack_1ff0 + 0x20);
  doc = (fdb_doc **)0x0;
  do {
    ppfStack_2168 = (fdb_doc **)0x11b3f1;
    sprintf((char *)apfStack_1ff0,"key%d",doc);
    ppfStack_2168 = (fdb_doc **)0x11b400;
    sprintf((char *)pfVar23,"body%d",doc);
    pfVar13 = pfStack_2140;
    ppfStack_2168 = (fdb_doc **)0x11b40d;
    sVar6 = strlen((char *)apfStack_1ff0);
    ppfStack_2168 = (fdb_doc **)0x11b418;
    sVar7 = strlen((char *)pfVar23);
    ppfStack_2168 = (fdb_doc **)0x11b42c;
    fdb_set_kv(pfVar13,apfStack_1ff0,sVar6,pfVar23,sVar7);
    uVar19 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar19;
  } while (uVar19 != 10);
  ppfStack_2168 = (fdb_doc **)0x11b43f;
  fdb_commit(pfStack_2138,'\0');
  ppfStack_2168 = (fdb_doc **)0x11b458;
  fdb_open(&pfStack_2128,"./iterator_test1",&fStack_20e8);
  ppfVar17 = (fdb_kvs_handle **)(auStack_2120 + 8);
  ppfStack_2168 = (fdb_doc **)0x11b474;
  fdb_kvs_open(pfStack_2128,ppfVar17,"db",(fdb_kvs_config *)(auStack_2120 + 0x10));
  ppfStack_2168 = (fdb_doc **)0x11b485;
  fdb_compact(pfStack_2138,"./iterator_test2");
  ppfStack_2168 = (fdb_doc **)0x11b4a3;
  fVar3 = fdb_iterator_init((fdb_kvs_handle *)auStack_2120._8_8_,&pfStack_2148,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_2168 = (fdb_doc **)0x11b4c1;
    fVar3 = fdb_iterator_sequence_init(pfStack_2140,&pfStack_2150,0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b62d;
    pcVar21 = (char *)&pfStack_2130;
    pfVar23 = (fdb_kvs_handle *)auStack_2120;
    doc = (fdb_doc **)0x0;
    do {
      ppfStack_2168 = (fdb_doc **)0x11b4f3;
      sprintf((char *)apfStack_1ff0,"key%d",doc);
      pfVar13 = pfStack_2140;
      ppfStack_2168 = (fdb_doc **)0x11b500;
      sVar6 = strlen((char *)apfStack_1ff0);
      ppfStack_2168 = (fdb_doc **)0x11b514;
      fdb_get_kv(pfVar13,apfStack_1ff0,sVar6,(void **)pcVar21,(size_t *)pfVar23);
      ppfStack_2168 = (fdb_doc **)0x11b51e;
      fdb_free_block(pfStack_2130);
      uVar19 = (int)doc + 1;
      doc = (fdb_doc **)(ulong)uVar19;
    } while (uVar19 != 10);
    ppfVar17 = &pfStack_2158;
    do {
      pfStack_2158 = (fdb_kvs_handle *)0x0;
      ppfStack_2168 = (fdb_doc **)0x11b540;
      fVar3 = fdb_iterator_get(pfStack_2148,(fdb_doc **)ppfVar17);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        ppfStack_2168 = (fdb_doc **)0x11b623;
        iterator_concurrent_compaction();
        goto LAB_0011b623;
      }
      ppfStack_2168 = (fdb_doc **)0x11b552;
      fdb_doc_free((fdb_doc *)pfStack_2158);
      ppfStack_2168 = (fdb_doc **)0x11b55c;
      fVar3 = fdb_iterator_next(pfStack_2148);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_2168 = (fdb_doc **)0x11b56b;
    fVar3 = fdb_iterator_close(pfStack_2148);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b632;
    ppfVar17 = &pfStack_2158;
    do {
      pfStack_2158 = (fdb_kvs_handle *)0x0;
      ppfStack_2168 = (fdb_doc **)0x11b58e;
      fVar3 = fdb_iterator_get(pfStack_2150,(fdb_doc **)ppfVar17);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011b623;
      ppfStack_2168 = (fdb_doc **)0x11b5a0;
      fdb_doc_free((fdb_doc *)pfStack_2158);
      ppfStack_2168 = (fdb_doc **)0x11b5aa;
      fVar3 = fdb_iterator_next(pfStack_2150);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_2168 = (fdb_doc **)0x11b5b9;
    fVar3 = fdb_iterator_close(pfStack_2150);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ppfStack_2168 = (fdb_doc **)0x11b5c7;
      fdb_close(pfStack_2138);
      ppfStack_2168 = (fdb_doc **)0x11b5d1;
      fdb_close(pfStack_2128);
      ppfStack_2168 = (fdb_doc **)0x11b5d6;
      fdb_shutdown();
      ppfStack_2168 = (fdb_doc **)0x11b5db;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_2168 = (fdb_doc **)0x11b60c;
      fprintf(_stderr,pcVar21,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b628:
    ppfStack_2168 = (fdb_doc **)0x11b62d;
    iterator_concurrent_compaction();
LAB_0011b62d:
    ppfStack_2168 = (fdb_doc **)0x11b632;
    iterator_concurrent_compaction();
LAB_0011b632:
    ppfStack_2168 = (fdb_doc **)0x11b637;
    iterator_concurrent_compaction();
  }
  doc_01 = (char *)apfStack_1ff0;
  ppfStack_2168 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_4440 = (fdb_doc **)0x11b659;
  ppfStack_2190 = ppfVar17;
  pfStack_2188 = pfVar23;
  ppfStack_2178 = (fdb_doc **)doc_01;
  ppfStack_2170 = (fdb_doc **)pcVar21;
  ppfStack_2168 = doc;
  gettimeofday(&tStack_43e8,(__timezone_ptr_t)0x0);
  ppfStack_4440 = (fdb_doc **)0x11b65e;
  memleak_start();
  pfStack_4418 = (fdb_doc *)0x0;
  ppfStack_4440 = (fdb_doc **)0x11b673;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar13 = (fdb_kvs_handle *)(auStack_42d8 + 0x108);
  ppfStack_4440 = (fdb_doc **)0x11b683;
  fdb_get_default_config();
  ppfStack_4440 = (fdb_doc **)0x11b68d;
  fdb_get_default_kvs_config();
  auStack_41c8[8] = '\0';
  auStack_41c8[9] = '\x02';
  auStack_41c8[10] = '\0';
  auStack_41c8[0xb] = '\0';
  auStack_41c8[0xc] = '\0';
  auStack_41c8[0xd] = '\0';
  auStack_41c8[0xe] = '\0';
  auStack_41c8[0xf] = '\0';
  auStack_41c8[0] = '\0';
  auStack_41c8[1] = '\x10';
  auStack_41c8[2] = '\0';
  auStack_41c8[3] = '\0';
  auStack_41c8[4] = '\0';
  auStack_41c8[5] = '\0';
  auStack_41c8[6] = '\0';
  auStack_41c8[7] = '\0';
  uStack_41ac = 1;
  uStack_41a2 = 0;
  uStack_41b4 = 1;
  ppfStack_4440 = (fdb_doc **)0x11b6c0;
  fVar3 = fdb_open(&pfStack_4428,"./iterator_test1",(fdb_config *)pfVar13);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_4440 = (fdb_doc **)0x11b6e3;
    fVar3 = fdb_kvs_open(pfStack_4428,&pfStack_4430,"DB",&fStack_4400);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb7e;
    ppfStack_4440 = (fdb_doc **)0x11b706;
    fVar3 = fdb_kvs_open(pfStack_4428,&pfStack_4410,"ODB",&fStack_4400);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb83;
    doc_01 = (char *)apfStack_43d8;
    pfVar23 = (fdb_kvs_handle *)auStack_42d8;
    pcVar21 = (char *)0x0;
    uVar28 = 0;
    do {
      ppfStack_4440 = (fdb_doc **)0x11b735;
      sprintf(doc_01,"key%d",uVar28 & 0xffffffff);
      ppfStack_4440 = (fdb_doc **)0x11b749;
      sprintf((char *)pfVar23,"body%d",uVar28 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_40d8 + (long)pcVar21);
      ppfStack_4440 = (fdb_doc **)0x11b75c;
      pfVar13 = (fdb_kvs_handle *)strlen(doc_01);
      ppfStack_4440 = (fdb_doc **)0x11b767;
      sVar6 = strlen((char *)pfVar23);
      ppfStack_4440 = (fdb_doc **)0x11b781;
      fdb_doc_create(doc,doc_01,(size_t)pfVar13,(void *)0x0,0,pfVar23,sVar6);
      ppfStack_4440 = (fdb_doc **)0x11b793;
      fVar3 = fdb_set(pfStack_4430,apfStack_40d8[uVar28]);
      pfVar11 = pfStack_4410;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011bb4c:
        ppfStack_4440 = (fdb_doc **)0x11bb51;
        iterator_offset_access_test();
        goto LAB_0011bb51;
      }
      ppfStack_4440 = (fdb_doc **)0x11b7a8;
      sVar6 = strlen(doc_01);
      ppfStack_4440 = (fdb_doc **)0x11b7c8;
      fVar3 = fdb_set_kv(pfVar11,doc_01,sVar6,&apfStack_40d8[uVar28]->offset,8);
      pfVar13 = pfVar11;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        ppfStack_4440 = (fdb_doc **)0x11bb4c;
        iterator_offset_access_test();
        goto LAB_0011bb4c;
      }
      uVar28 = uVar28 + 1;
      pcVar21 = (char *)((long)pcVar21 + 8);
    } while (uVar28 != 1000);
    ppfStack_4440 = (fdb_doc **)0x11b7f3;
    fVar3 = fdb_commit(pfStack_4428,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb88;
    pfVar13 = (fdb_kvs_handle *)0xfa;
    doc_01 = "key%d";
    pcVar21 = (char *)apfStack_43d8;
    do {
      ppfStack_4440 = (fdb_doc **)0x11b81b;
      sprintf(pcVar21,"key%d",pfVar13);
      pfVar23 = pfStack_4430;
      ppfStack_4440 = (fdb_doc **)0x11b828;
      sVar6 = strlen(pcVar21);
      ppfStack_4440 = (fdb_doc **)0x11b836;
      fVar3 = fdb_del_kv(pfVar23,pcVar21,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb51;
      uVar19 = (int)pfVar13 + 1;
      pfVar13 = (fdb_kvs_handle *)(ulong)uVar19;
    } while (uVar19 != 500);
    doc_01 = (char *)apfStack_43d8;
    pfVar23 = (fdb_kvs_handle *)auStack_42d8;
    pcVar21 = (char *)0x0;
    uVar28 = 0;
    do {
      ppfStack_4440 = (fdb_doc **)0x11b86f;
      sprintf(doc_01,"k0y%d",uVar28 & 0xffffffff);
      ppfStack_4440 = (fdb_doc **)0x11b883;
      sprintf((char *)pfVar23,"b0dy%d",uVar28 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_40d8 + (long)pcVar21);
      ppfStack_4440 = (fdb_doc **)0x11b89b;
      fdb_doc_free(apfStack_40d8[uVar28]);
      ppfStack_4440 = (fdb_doc **)0x11b8a3;
      pfVar13 = (fdb_kvs_handle *)strlen(doc_01);
      ppfStack_4440 = (fdb_doc **)0x11b8ae;
      sVar6 = strlen((char *)pfVar23);
      ppfStack_4440 = (fdb_doc **)0x11b8c8;
      fdb_doc_create(doc,doc_01,(size_t)pfVar13,(void *)0x0,0,pfVar23,sVar6);
      ppfStack_4440 = (fdb_doc **)0x11b8da;
      fVar3 = fdb_set(pfStack_4430,apfStack_40d8[uVar28]);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb56;
      uVar28 = uVar28 + 1;
      pcVar21 = (char *)((long)pcVar21 + 8);
    } while (uVar28 != 0xfa);
    ppfStack_4440 = (fdb_doc **)0x11b902;
    fVar3 = fdb_commit(pfStack_4428,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb8d;
    ppfStack_4440 = (fdb_doc **)0x11b92a;
    fdb_iterator_init(pfStack_4410,&pfStack_4420,(void *)0x0,0,(void *)0x0,0,2);
    pfVar23 = (fdb_kvs_handle *)0x1ea;
    pfVar13 = afStack_3138;
    doc_01 = (char *)&pfStack_4418;
    pcVar21 = (char *)&pfStack_4408;
    do {
      ppfStack_4440 = (fdb_doc **)0x11b94f;
      fVar3 = fdb_get_byoffset(pfStack_4430,*(fdb_doc **)&pfVar13->kvs_config);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb60;
      ppfStack_4440 = (fdb_doc **)0x11b96d;
      fVar3 = fdb_iterator_seek(pfStack_4420,(void *)(*(size_t **)&pfVar13->kvs_config)[4],
                                **(size_t **)&pfVar13->kvs_config,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb5b;
      ppfStack_4440 = (fdb_doc **)0x11b982;
      fVar3 = fdb_iterator_get(pfStack_4420,(fdb_doc **)doc_01);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb6a;
      pfVar15 = *(fdb_doc **)&pfVar13->kvs_config;
      if (*pfStack_4418->body != (*(fdb_doc **)&pfVar13->kvs_config)->offset) {
        ppfStack_4440 = (fdb_doc **)0x11b9e3;
        iterator_offset_access_test();
        pfVar15 = pfStack_4408;
      }
      ppfStack_4440 = (fdb_doc **)0x11b9a9;
      fVar3 = fdb_del(pfStack_4430,pfVar15);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb65;
      ppfStack_4440 = (fdb_doc **)0x11b9be;
      fdb_get_metaonly(pfStack_4430,*(fdb_doc **)&pfVar13->kvs_config);
      pfVar23 = (fdb_kvs_handle *)((long)&(pfVar23->kvs_config).custom_cmp + 2);
      pfVar13 = (fdb_kvs_handle *)&pfVar13->dhandle;
    } while (pfVar23 < (fdb_kvs_handle *)0x3de);
    ppfStack_4440 = (fdb_doc **)0x11b9f4;
    fdb_iterator_close(pfStack_4420);
    ppfStack_4440 = (fdb_doc **)0x11ba03;
    fVar3 = fdb_commit(pfStack_4428,'\x01');
    if (fVar3 == FDB_RESULT_SUCCESS) {
      doc_01 = (char *)apfStack_43d8;
      pcVar21 = "b1dy%d";
      pfVar23 = (fdb_kvs_handle *)auStack_42d8;
      doc = (fdb_doc **)0x0;
      do {
        ppfStack_4440 = (fdb_doc **)0x11ba34;
        sprintf(doc_01,"k1y%d",doc);
        ppfStack_4440 = (fdb_doc **)0x11ba43;
        sprintf((char *)pfVar23,"b1dy%d",doc);
        pfVar11 = pfStack_4430;
        ppfStack_4440 = (fdb_doc **)0x11ba50;
        pfVar13 = (fdb_kvs_handle *)strlen(doc_01);
        ppfStack_4440 = (fdb_doc **)0x11ba5b;
        sVar6 = strlen((char *)pfVar23);
        ppfStack_4440 = (fdb_doc **)0x11ba6f;
        fVar3 = fdb_set_kv(pfVar11,doc_01,(size_t)pfVar13,pfVar23,sVar6);
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bb6f;
        uVar19 = (int)doc + 1;
        doc = (fdb_doc **)(ulong)uVar19;
      } while (uVar19 != 0xfa);
      doc_01 = (char *)0x1ea;
      pfVar13 = afStack_3138;
      while( true ) {
        ppfStack_4440 = (fdb_doc **)0x11ba9c;
        fVar3 = fdb_get_byoffset(pfStack_4430,*(fdb_doc **)&pfVar13->kvs_config);
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar13->kvs_config + 0x48) == '\0') {
          ppfStack_4440 = (fdb_doc **)0x11bac9;
          iterator_offset_access_test();
        }
        doc_01 = (char *)((long)doc_01 + 10);
        pfVar13 = (fdb_kvs_handle *)&pfVar13->dhandle;
        if ((fdb_doc **)0x3dd < doc_01) {
          lVar22 = 0;
          do {
            ppfStack_4440 = (fdb_doc **)0x11bada;
            fdb_doc_free(apfStack_40d8[lVar22]);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 1000);
          ppfStack_4440 = (fdb_doc **)0x11baf0;
          fdb_doc_free(pfStack_4418);
          ppfStack_4440 = (fdb_doc **)0x11bafa;
          fdb_close(pfStack_4428);
          ppfStack_4440 = (fdb_doc **)0x11baff;
          fdb_shutdown();
          ppfStack_4440 = (fdb_doc **)0x11bb04;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          ppfStack_4440 = (fdb_doc **)0x11bb35;
          fprintf(_stderr,pcVar21,"iterator offset access test");
          return;
        }
      }
LAB_0011bb74:
      ppfStack_4440 = (fdb_doc **)0x11bb79;
      iterator_offset_access_test();
      goto LAB_0011bb79;
    }
  }
  else {
LAB_0011bb79:
    ppfStack_4440 = (fdb_doc **)0x11bb7e;
    iterator_offset_access_test();
LAB_0011bb7e:
    ppfStack_4440 = (fdb_doc **)0x11bb83;
    iterator_offset_access_test();
LAB_0011bb83:
    ppfStack_4440 = (fdb_doc **)0x11bb88;
    iterator_offset_access_test();
LAB_0011bb88:
    ppfStack_4440 = (fdb_doc **)0x11bb8d;
    iterator_offset_access_test();
LAB_0011bb8d:
    ppfStack_4440 = (fdb_doc **)0x11bb92;
    iterator_offset_access_test();
  }
  ppfStack_4440 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_48c8 = (fdb_iterator **)0x11bbb2;
  pfStack_4460 = pfVar13;
  pfStack_4458 = pfVar23;
  ppfStack_4450 = (fdb_doc **)doc_01;
  ppfStack_4448 = (fdb_doc **)pcVar21;
  ppfStack_4440 = doc;
  gettimeofday(&tStack_4890,(__timezone_ptr_t)0x0);
  ppfStack_48c8 = (fdb_iterator **)0x11bbb7;
  memleak_start();
  ppfStack_48c8 = (fdb_iterator **)0x11bbc7;
  fdb_get_default_config();
  fStack_4658.buffercache_size = 0;
  ppfStack_48c8 = (fdb_iterator **)0x11bbdf;
  fdb_get_default_kvs_config();
  ppfStack_48c8 = (fdb_iterator **)0x11bc02;
  sprintf(acStack_4760,"rm -rf  %s*","./dummy");
  ppfStack_48c8 = (fdb_iterator **)0x11bc0a;
  system(acStack_4760);
  ppfStack_48c8 = (fdb_iterator **)0x11bc1d;
  fdb_open(&pfStack_4898,"./dummy",&fStack_4658);
  ppfStack_48c8 = (fdb_iterator **)0x11bc30;
  fdb_kvs_open(pfStack_4898,&pfStack_48a0,(char *)0x0,&fStack_4778);
  uVar28 = 0;
  do {
    ppfStack_48c8 = (fdb_iterator **)0x11bc5c;
    sprintf((char *)apfStack_4880,"k%06d\n",uVar28);
    ppfStack_48c8 = (fdb_iterator **)0x11bc6b;
    sprintf(acStack_4560,"v%06d\n",uVar28);
    ppfStack_48c8 = (fdb_iterator **)0x11bc86;
    fdb_set_kv(pfStack_48a0,apfStack_4880,8,acStack_4560,8);
    uVar19 = (int)uVar28 + 1;
    uVar28 = (ulong)uVar19;
  } while (uVar19 != 3);
  ppfStack_48c8 = (fdb_iterator **)0x11bca8;
  sprintf((char *)apfStack_4880,"k%06d\n",1);
  ppfStack_48c8 = (fdb_iterator **)0x11bcba;
  fdb_del_kv(pfStack_48a0,apfStack_4880,8);
  ppfStack_48c8 = (fdb_iterator **)0x11bcc6;
  fdb_commit(pfStack_4898,'\0');
  apfStack_4880[0]._0_2_ = 0x61;
  acStack_4760[0] = 'z';
  acStack_4760[1] = '\0';
  ppfStack_48c8 = (fdb_iterator **)0x11bcfd;
  fVar3 = fdb_iterator_init(pfStack_48a0,&pfStack_48b0,apfStack_4880,1,acStack_4760,1,2);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStack_48c8 = (fdb_iterator **)0x11bd0f;
    fVar3 = fdb_iterator_seek_to_max(pfStack_48b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf38;
    pfStack_48a8 = (fdb_doc *)0x0;
    ppfStack_48c8 = (fdb_iterator **)0x11bd2d;
    fVar3 = fdb_iterator_get(pfStack_48b0,&pfStack_48a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf3d;
    ppfStack_48c8 = (fdb_iterator **)0x11bd50;
    sprintf((char *)apfStack_4880,"k%06d\n",2);
    if (*pfStack_48a8->key != CONCAT62(apfStack_4880[0]._2_6_,apfStack_4880[0]._0_2_))
    goto LAB_0011bf42;
    ppfStack_48c8 = (fdb_iterator **)0x11bd6a;
    fdb_doc_free(pfStack_48a8);
    ppfStack_48c8 = (fdb_iterator **)0x11bd74;
    fVar3 = fdb_iterator_prev(pfStack_48b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf4c;
    pfStack_48a8 = (fdb_doc *)0x0;
    ppfStack_48c8 = (fdb_iterator **)0x11bd92;
    fVar3 = fdb_iterator_get(pfStack_48b0,&pfStack_48a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf51;
    ppfStack_48c8 = (fdb_iterator **)0x11bdb2;
    sprintf((char *)apfStack_4880,"k%06d\n",0);
    if (*pfStack_48a8->key != CONCAT62(apfStack_4880[0]._2_6_,apfStack_4880[0]._0_2_))
    goto LAB_0011bf56;
    ppfStack_48c8 = (fdb_iterator **)0x11bdcc;
    fdb_doc_free(pfStack_48a8);
    ppfVar12 = &pfStack_48b0;
    ppfStack_48c8 = (fdb_iterator **)0x11bdd9;
    fdb_iterator_close(pfStack_48b0);
    ppfStack_48c8 = (fdb_iterator **)0x11be05;
    fVar3 = fdb_iterator_init(pfStack_48a0,ppfVar12,apfStack_4880,1,acStack_4760,1,2);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf60;
    ppfStack_48c8 = (fdb_iterator **)0x11be17;
    fVar3 = fdb_iterator_seek_to_min(pfStack_48b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf65;
    pfStack_48a8 = (fdb_doc *)0x0;
    ppfStack_48c8 = (fdb_iterator **)0x11be35;
    fVar3 = fdb_iterator_get(pfStack_48b0,&pfStack_48a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf6a;
    ppfVar12 = apfStack_4880;
    ppfStack_48c8 = (fdb_iterator **)0x11be55;
    sprintf((char *)ppfVar12,"k%06d\n",0);
    if (*pfStack_48a8->key != CONCAT62(apfStack_4880[0]._2_6_,apfStack_4880[0]._0_2_))
    goto LAB_0011bf6f;
    ppfStack_48c8 = (fdb_iterator **)0x11be6f;
    fdb_doc_free(pfStack_48a8);
    ppfStack_48c8 = (fdb_iterator **)0x11be79;
    fVar3 = fdb_iterator_next(pfStack_48b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf79;
    pfStack_48a8 = (fdb_doc *)0x0;
    ppfStack_48c8 = (fdb_iterator **)0x11be97;
    fVar3 = fdb_iterator_get(pfStack_48b0,&pfStack_48a8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011bf7e;
    ppfVar12 = apfStack_4880;
    ppfStack_48c8 = (fdb_iterator **)0x11beba;
    sprintf((char *)ppfVar12,"k%06d\n",2);
    if (*pfStack_48a8->key == CONCAT62(apfStack_4880[0]._2_6_,apfStack_4880[0]._0_2_)) {
      ppfStack_48c8 = (fdb_iterator **)0x11bed4;
      fdb_doc_free(pfStack_48a8);
      ppfStack_48c8 = (fdb_iterator **)0x11bede;
      fdb_iterator_close(pfStack_48b0);
      ppfStack_48c8 = (fdb_iterator **)0x11bee8;
      fdb_close(pfStack_4898);
      ppfStack_48c8 = (fdb_iterator **)0x11beed;
      fdb_shutdown();
      ppfStack_48c8 = (fdb_iterator **)0x11bef2;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_48c8 = (fdb_iterator **)0x11bf23;
      fprintf(_stderr,pcVar21,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_48c8 = (fdb_iterator **)0x11bf38;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf38:
    ppfStack_48c8 = (fdb_iterator **)0x11bf3d;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf3d:
    ppfStack_48c8 = (fdb_iterator **)0x11bf42;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf42:
    ppfStack_48c8 = (fdb_iterator **)0x11bf4c;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf4c:
    ppfStack_48c8 = (fdb_iterator **)0x11bf51;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf51:
    ppfStack_48c8 = (fdb_iterator **)0x11bf56;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf56:
    ppfVar12 = apfStack_4880;
    ppfStack_48c8 = (fdb_iterator **)0x11bf60;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf60:
    ppfStack_48c8 = (fdb_iterator **)0x11bf65;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf65:
    ppfStack_48c8 = (fdb_iterator **)0x11bf6a;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6a:
    ppfStack_48c8 = (fdb_iterator **)0x11bf6f;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6f:
    ppfStack_48c8 = (fdb_iterator **)0x11bf79;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf79:
    ppfStack_48c8 = (fdb_iterator **)0x11bf7e;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf7e:
    ppfStack_48c8 = (fdb_iterator **)0x11bf83;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_48c8 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_4a20 = (code *)0x11bfa1;
  ppfStack_48c8 = ppfVar12;
  gettimeofday(&tStack_49d0,(__timezone_ptr_t)0x0);
  pfStack_4a08 = (fdb_doc *)0x0;
  pcStack_4a20 = (code *)0x11bfaf;
  memleak_start();
  pfVar18 = &fStack_49c0;
  pcStack_4a20 = (code *)0x11bfbc;
  fdb_get_default_config();
  pcStack_4a20 = (code *)0x11bfc6;
  fdb_get_default_kvs_config();
  pcStack_4a20 = (code *)0x11bfd2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_4a20 = (code *)0x11bfe6;
  fVar3 = fdb_open(&pfStack_49f0,"./iterator_test1",pfVar18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_4a20 = (code *)0x11c002;
    fVar3 = fdb_kvs_open_default(pfStack_49f0,&pfStack_49f8,&fStack_49e8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c20d;
    pcStack_4a20 = (code *)0x11c025;
    fdb_set_kv(pfStack_49f8,"a",1,(void *)0x0,0);
    pfVar18 = (fdb_config *)0x154b95;
    pcStack_4a20 = (code *)0x11c043;
    fdb_set_kv(pfStack_49f8,"b",1,(void *)0x0,0);
    pcStack_4a20 = (code *)0x11c05e;
    fdb_set_kv(pfStack_49f8,"c",1,(void *)0x0,0);
    pcStack_4a20 = (code *)0x11c082;
    fVar3 = fdb_iterator_init(pfStack_49f8,&pfStack_4a00,"b",1,(void *)0x0,0,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c214;
    pcStack_4a20 = (code *)0x11c094;
    fVar3 = fdb_iterator_seek_to_min(pfStack_4a00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c219;
    pcStack_4a20 = (code *)0x11c0ab;
    fVar3 = fdb_iterator_get(pfStack_4a00,&pfStack_4a08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c220;
    if (*pfStack_4a08->key != 'b') goto LAB_0011c227;
    pcStack_4a20 = (code *)0x11c0ca;
    fdb_doc_free(pfStack_4a08);
    pfStack_4a08 = (fdb_doc *)0x0;
    pcStack_4a20 = (code *)0x11c0dd;
    fVar3 = fdb_iterator_seek_to_max(pfStack_4a00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c22f;
    pcStack_4a20 = (code *)0x11c0f4;
    fVar3 = fdb_iterator_get(pfStack_4a00,&pfStack_4a08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c236;
    if (*pfStack_4a08->key != 'c') goto LAB_0011c23d;
    pcStack_4a20 = (code *)0x11c113;
    fdb_doc_free(pfStack_4a08);
    pfStack_4a08 = (fdb_doc *)0x0;
    pcStack_4a20 = (code *)0x11c126;
    fVar3 = fdb_iterator_prev(pfStack_4a00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c245;
    pcStack_4a20 = (code *)0x11c13d;
    fVar3 = fdb_iterator_get(pfStack_4a00,&pfStack_4a08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c24c;
    if (*pfStack_4a08->key != 'b') goto LAB_0011c253;
    pcStack_4a20 = (code *)0x11c15c;
    fdb_doc_free(pfStack_4a08);
    pfStack_4a08 = (fdb_doc *)0x0;
    pcStack_4a20 = (code *)0x11c16f;
    fVar3 = fdb_iterator_next(pfStack_4a00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c25b;
    pcStack_4a20 = (code *)0x11c186;
    fVar3 = fdb_iterator_get(pfStack_4a00,&pfStack_4a08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c262;
    if (*pfStack_4a08->key == 'c') {
      pcStack_4a20 = (code *)0x11c1a5;
      fdb_doc_free(pfStack_4a08);
      pfStack_4a08 = (fdb_doc *)0x0;
      pcStack_4a20 = (code *)0x11c1b8;
      fdb_iterator_close(pfStack_4a00);
      pcStack_4a20 = (code *)0x11c1c2;
      fdb_close(pfStack_49f0);
      pcStack_4a20 = (code *)0x11c1c7;
      fdb_shutdown();
      pcStack_4a20 = (code *)0x11c1cc;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_4a20 = (code *)0x11c1fd;
      fprintf(_stderr,pcVar21,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_4a20 = (code *)0x11c20d;
    iterator_uncommited_seeks();
LAB_0011c20d:
    pcStack_4a20 = (code *)0x11c214;
    iterator_uncommited_seeks();
LAB_0011c214:
    pcStack_4a20 = (code *)0x11c219;
    iterator_uncommited_seeks();
LAB_0011c219:
    pcStack_4a20 = (code *)0x11c220;
    iterator_uncommited_seeks();
LAB_0011c220:
    pcStack_4a20 = (code *)0x11c227;
    iterator_uncommited_seeks();
LAB_0011c227:
    pcStack_4a20 = (code *)0x11c22f;
    iterator_uncommited_seeks();
LAB_0011c22f:
    pcStack_4a20 = (code *)0x11c236;
    iterator_uncommited_seeks();
LAB_0011c236:
    pcStack_4a20 = (code *)0x11c23d;
    iterator_uncommited_seeks();
LAB_0011c23d:
    pcStack_4a20 = (code *)0x11c245;
    iterator_uncommited_seeks();
LAB_0011c245:
    pcStack_4a20 = (code *)0x11c24c;
    iterator_uncommited_seeks();
LAB_0011c24c:
    pcStack_4a20 = (code *)0x11c253;
    iterator_uncommited_seeks();
LAB_0011c253:
    pcStack_4a20 = (code *)0x11c25b;
    iterator_uncommited_seeks();
LAB_0011c25b:
    pcStack_4a20 = (code *)0x11c262;
    iterator_uncommited_seeks();
LAB_0011c262:
    pcStack_4a20 = (code *)0x11c269;
    iterator_uncommited_seeks();
  }
  pcStack_4a20 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_4dc8 = (fdb_config *)0x11c28b;
  pfStack_4a30 = pfVar18;
  pcStack_4a28 = (char *)apfStack_4880;
  pcStack_4a20 = (code *)uVar28;
  gettimeofday(&tStack_4d40,(__timezone_ptr_t)0x0);
  pfStack_4dc8 = (fdb_config *)0x11c290;
  memleak_start();
  pfVar18 = &fStack_4c28;
  pfStack_4dc8 = (fdb_config *)0x11c2a0;
  fdb_get_default_config();
  fStack_4c28.buffercache_size = 0;
  pfStack_4dc8 = (fdb_config *)0x11c2b2;
  fdb_get_default_kvs_config();
  pfStack_4dc8 = (fdb_config *)0x11c2d2;
  sprintf(acStack_4b30,"rm -rf  %s*","./iterator_test");
  pfStack_4dc8 = (fdb_config *)0x11c2da;
  system(acStack_4b30);
  pfStack_4dc8 = (fdb_config *)0x11c2ee;
  fVar3 = fdb_open(&pfStack_4da0,"./iterator_test1",pfVar18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_4dc8 = (fdb_config *)0x11c30c;
    fVar3 = fdb_kvs_open(pfStack_4da0,&pfStack_4da8,(char *)0x0,&fStack_4d58);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4a6;
    uStack_4d68 = 0x34323634353773;
    uStack_4d61 = 0xff;
    uStack_4d80 = 0x34323634353773;
    uStack_4d79 = 0x10000ff;
    uStack_4d70._0_4_ = 0x34353773;
    uStack_4d70._4_1_ = true;
    uStack_4d70._5_1_ = true;
    uStack_4d70._6_1_ = '4';
    uStack_4d70._7_1_ = 0xff;
    uStack_4d90 = 0xff34323634353773;
    uStack_4d88 = 0xff;
    uStack_4d30 = 0x3179656b;
    uStack_4d2c = 0;
    pfStack_4dc8 = (fdb_config *)0x11c370;
    fVar3 = fdb_set_kv(pfStack_4da8,&uStack_4d68,0xb,&uStack_4d30,4);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4ab;
    uStack_4d2c = 0;
    uStack_4d30 = 0x3279656b;
    pfStack_4dc8 = (fdb_config *)0x11c3a4;
    fVar3 = fdb_set_kv(pfStack_4da8,&uStack_4d80,0xb,&uStack_4d30,4);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4b0;
    pfStack_4dc8 = (fdb_config *)0x11c3bb;
    fVar3 = fdb_commit(pfStack_4da0,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4b5;
    pfStack_4dc8 = (fdb_config *)0x11c3ee;
    fVar3 = fdb_iterator_init(pfStack_4da8,&pfStack_4db0,&uStack_4d70,8,&uStack_4d90,9,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4ba;
    iVar4 = 0;
    pfVar18 = (fdb_config *)&pfStack_4d98;
    do {
      pfStack_4d98 = (fdb_doc *)0x0;
      pfStack_4dc8 = (fdb_config *)0x11c413;
      fVar3 = fdb_iterator_get(pfStack_4db0,(fdb_doc **)pfVar18);
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      iVar4 = iVar4 + 1;
      pfStack_4dc8 = (fdb_config *)0x11c423;
      fdb_doc_free(pfStack_4d98);
      pfStack_4dc8 = (fdb_config *)0x11c42d;
      fVar3 = fdb_iterator_next(pfStack_4db0);
    } while (fVar3 == FDB_RESULT_SUCCESS);
    if (iVar4 != 2) goto LAB_0011c4bf;
    pfStack_4dc8 = (fdb_config *)0x11c444;
    fVar3 = fdb_iterator_close(pfStack_4db0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4c4;
    pfStack_4dc8 = (fdb_config *)0x11c452;
    fVar3 = fdb_close(pfStack_4da0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c4c9;
    pfStack_4dc8 = (fdb_config *)0x11c45b;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_4dc8 = (fdb_config *)0x11c464;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_4dc8 = (fdb_config *)0x11c495;
      fprintf(_stderr,pcVar21,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_4dc8 = (fdb_config *)0x11c4a6;
    iterator_init_using_substring_test();
LAB_0011c4a6:
    pfStack_4dc8 = (fdb_config *)0x11c4ab;
    iterator_init_using_substring_test();
LAB_0011c4ab:
    pfStack_4dc8 = (fdb_config *)0x11c4b0;
    iterator_init_using_substring_test();
LAB_0011c4b0:
    pfStack_4dc8 = (fdb_config *)0x11c4b5;
    iterator_init_using_substring_test();
LAB_0011c4b5:
    pfStack_4dc8 = (fdb_config *)0x11c4ba;
    iterator_init_using_substring_test();
LAB_0011c4ba:
    pfStack_4dc8 = (fdb_config *)0x11c4bf;
    iterator_init_using_substring_test();
LAB_0011c4bf:
    pfStack_4dc8 = (fdb_config *)0x11c4c4;
    iterator_init_using_substring_test();
LAB_0011c4c4:
    pfStack_4dc8 = (fdb_config *)0x11c4c9;
    iterator_init_using_substring_test();
LAB_0011c4c9:
    pfStack_4dc8 = (fdb_config *)0x11c4ce;
    iterator_init_using_substring_test();
  }
  pfStack_4dc8 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_4f20 = (fdb_config *)0x11c4e9;
  pfStack_4dc8 = pfVar18;
  gettimeofday(&tStack_4ed0,(__timezone_ptr_t)0x0);
  pfStack_4f20 = (fdb_config *)0x11c4ee;
  memleak_start();
  pfStack_4f08 = (fdb_iterator *)0x0;
  pfStack_4ef8 = (fdb_doc *)0x0;
  pfVar18 = &fStack_4ec0;
  pfStack_4f20 = (fdb_config *)0x11c505;
  fdb_get_default_config();
  pfStack_4f20 = (fdb_config *)0x11c50f;
  fdb_get_default_kvs_config();
  pfStack_4f20 = (fdb_config *)0x11c51b;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_4f20 = (fdb_config *)0x11c52f;
  fVar3 = fdb_open(&pfStack_4ef0,"./iterator_test1",pfVar18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_4f20 = (fdb_config *)0x11c54b;
    fVar3 = fdb_kvs_open_default(pfStack_4ef0,&pfStack_4f00,&fStack_4ee8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c708;
    pfStack_4f20 = (fdb_config *)0x11c56e;
    fdb_set_kv(pfStack_4f00,"A",1,(void *)0x0,0);
    pfVar18 = (fdb_config *)0x154dcc;
    pfStack_4f20 = (fdb_config *)0x11c58c;
    fdb_set_kv(pfStack_4f00,"B",1,(void *)0x0,0);
    pfStack_4f20 = (fdb_config *)0x11c5b7;
    fVar3 = fdb_iterator_init(pfStack_4f00,&pfStack_4f08,"B",1,"Bzz",3,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c70f;
    pfStack_4f20 = (fdb_config *)0x11c5c9;
    fVar3 = fdb_iterator_seek_to_max(pfStack_4f08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c714;
    pfStack_4f20 = (fdb_config *)0x11c5e0;
    fVar3 = fdb_iterator_get(pfStack_4f08,&pfStack_4ef8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c71b;
    if (*pfStack_4ef8->key != 'B') goto LAB_0011c722;
    pfStack_4f20 = (fdb_config *)0x11c5ff;
    fdb_doc_free(pfStack_4ef8);
    pfStack_4ef8 = (fdb_doc *)0x0;
    pfStack_4f20 = (fdb_config *)0x11c612;
    fVar3 = fdb_iterator_close(pfStack_4f08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c72a;
    pfStack_4f08 = (fdb_iterator *)0x0;
    pfStack_4f20 = (fdb_config *)0x11c639;
    fVar3 = fdb_del_kv(pfStack_4f00,"B",1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c731;
    pfStack_4f20 = (fdb_config *)0x11c670;
    fVar3 = fdb_iterator_init(pfStack_4f00,&pfStack_4f08,"B",1,"Bzz",3,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c738;
    pfStack_4f20 = (fdb_config *)0x11c687;
    fVar3 = fdb_iterator_get(pfStack_4f08,&pfStack_4ef8);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c73d;
    pfStack_4f20 = (fdb_config *)0x11c69a;
    fVar3 = fdb_iterator_seek_to_max(pfStack_4f08);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c742;
    pfStack_4f20 = (fdb_config *)0x11c6ad;
    fVar3 = fdb_close(pfStack_4ef0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c747;
    pfStack_4f20 = (fdb_config *)0x11c6ba;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_4f20 = (fdb_config *)0x11c6c7;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_4f20 = (fdb_config *)0x11c6f8;
      fprintf(_stderr,pcVar21,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_4f20 = (fdb_config *)0x11c708;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c708:
    pfStack_4f20 = (fdb_config *)0x11c70f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c70f:
    pfStack_4f20 = (fdb_config *)0x11c714;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c714:
    pfStack_4f20 = (fdb_config *)0x11c71b;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c71b:
    pfStack_4f20 = (fdb_config *)0x11c722;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c722:
    pfStack_4f20 = (fdb_config *)0x11c72a;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c72a:
    pfStack_4f20 = (fdb_config *)0x11c731;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c731:
    pfStack_4f20 = (fdb_config *)0x11c738;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c738:
    pfStack_4f20 = (fdb_config *)0x11c73d;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c73d:
    pfStack_4f20 = (fdb_config *)0x11c742;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c742:
    pfStack_4f20 = (fdb_config *)0x11c747;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c747:
    pfStack_4f20 = (fdb_config *)0x11c74e;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_4f20 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_4f20 = pfVar18;
  gettimeofday(&tStack_5028,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_5060 = (fdb_iterator *)0x0;
  pfStack_5048 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar3 = fdb_open(&pfStack_5050,"./iterator_test1",&fStack_5018);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_kvs_open_default(pfStack_5050,&pfStack_5058,&fStack_5040);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c8f5;
    fdb_set_kv(pfStack_5058,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_5058,"C",1,(void *)0x0,0);
    fVar3 = fdb_del_kv(pfStack_5058,"B",1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c8fc;
    fVar3 = fdb_iterator_init(pfStack_5058,&pfStack_5060,"A",1,"B",1,0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c903;
    fVar3 = fdb_iterator_get(pfStack_5060,&pfStack_5048);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c908;
    fVar3 = fdb_iterator_seek_to_min(pfStack_5060);
    if (fVar3 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c90d;
    fVar3 = fdb_iterator_close(pfStack_5060);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011c912;
    fVar3 = fdb_close(pfStack_5050);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar21,"iterator seek to min test");
        return;
      }
      goto LAB_0011c920;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8f5:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8fc:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c903:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c908:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c90d:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c912:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c920:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar4 = 0;
  do {
    iterator_complete_test(iVar4,0);
    iterator_complete_test(iVar4,1);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void reverse_sequence_iterator_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, r, count;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc **doc2 = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_iterator *iterator2;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    status = fdb_set_log_callback(kv1, logCallbackFunc,
                                  (void *) "reverse_sequence_iterator_kvs_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store...
    status = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // to 'kv2' with entire range
    for (i=0;i<n;++i) {
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv2, doc2[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // insert kv1 documents of even number
    for (i=0;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert kv1 documents of odd number
    for (i=1;i<n;i+=2) {
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv1, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // iterate even docs on kv1
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=0;
    count = 0;
    while (1) {
        fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        count++;
        if (i + 2 >= n) {
            break;
        }
        i = i + 2; // by-seq, first come even docs, then odd
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) break;
    }
    TEST_CHK(count==n/2);

    // iterate all docs over kv2
    status = fdb_iterator_sequence_init(kv2, &iterator2, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while(1) {
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        status = fdb_iterator_next(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }

    // manually flush WAL & commit
    // iterators should be unaffected
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // reverse iterate even docs over kv1
     i = n - 4;
    count = 0;
    while (1) {
        status = fdb_iterator_prev(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i-=2;
        count++;
    }

    TEST_CHK(count==4);
    fdb_iterator_close(iterator);

    i = n-1;
    count = 0;
    // reverse iterate all docs over kv2
    while (1) {
        status = fdb_iterator_prev(iterator2);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
        status = fdb_iterator_get(iterator2, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->key, doc2[i]->key, rdoc->keylen));
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i--;
        count++;
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator2);

    // re-open iterator after commit should return all docs for kv1
    i = 0;
    count = 0;
    status = fdb_iterator_sequence_init(kv1, &iterator, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    while (1) {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        if (i == 8) {
            i=1; // switch to odds
        } else {
            i+=2;
        }
        count++;
        status = fdb_iterator_next(iterator);
        if (status == FDB_RESULT_ITERATOR_FAIL) {
            break;
        }
    }
    TEST_CHK(count==n);
    fdb_iterator_close(iterator);

    // free all documents
    for (i=0;i<n;++i) {
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("reverse sequence iterator kvs test");

}